

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined4 uVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  uint uVar76;
  uint uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  long lVar80;
  uint uVar81;
  byte bVar82;
  ulong uVar83;
  undefined4 uVar84;
  undefined8 in_R11;
  bool bVar85;
  byte bVar86;
  float fVar87;
  float fVar118;
  vint4 bi_2;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar100 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar126 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar131 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  vint4 ai_2;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar172 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  vint4 ai;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar195;
  float fVar211;
  float fVar212;
  vint4 bi;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar202 [32];
  float fVar213;
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar217;
  float fVar223;
  float fVar224;
  vint4 ai_1;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar229 [16];
  undefined1 auVar231 [32];
  undefined1 auVar230 [16];
  undefined1 auVar232 [64];
  float fVar233;
  float fVar239;
  float fVar240;
  undefined1 auVar234 [16];
  float fVar241;
  undefined1 auVar237 [32];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar238 [64];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [28];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [64];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar267;
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  float fVar268;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  float s;
  undefined1 auVar276 [32];
  undefined1 auVar269 [16];
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  undefined1 auVar274 [16];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [64];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [64];
  undefined1 auVar286 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c04;
  uint uStack_b64;
  float local_b20;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  undefined4 local_a20;
  RTCFilterFunctionNArguments local_9f0;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [16];
  undefined1 local_8f0 [16];
  Primitive *local_8d8;
  ulong local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [16];
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 uStack_848;
  undefined4 uStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  uint local_7c0;
  uint uStack_7bc;
  uint uStack_7b8;
  uint uStack_7b4;
  uint local_7b0;
  uint uStack_7ac;
  uint uStack_7a8;
  uint uStack_7a4;
  RTCHitN local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined4 local_780;
  undefined4 uStack_77c;
  undefined4 uStack_778;
  undefined4 uStack_774;
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined8 local_750;
  undefined8 uStack_748;
  undefined1 local_740 [16];
  uint local_730;
  uint uStack_72c;
  uint uStack_728;
  uint uStack_724;
  uint uStack_720;
  uint uStack_71c;
  uint uStack_718;
  uint uStack_714;
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined4 local_5c0;
  undefined4 uStack_5bc;
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  undefined4 uStack_5b0;
  undefined4 uStack_5ac;
  undefined4 uStack_5a8;
  undefined4 uStack_5a4;
  undefined4 local_5a0;
  undefined4 uStack_59c;
  undefined4 uStack_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 uStack_588;
  undefined4 uStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined4 uStack_264;
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar266 [64];
  undefined1 auVar275 [16];
  
  PVar1 = prim[1];
  uVar78 = (ulong)(byte)PVar1;
  auVar4 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar4 = vinsertps_avx(auVar4,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar87 = *(float *)(prim + uVar78 * 0x19 + 0x12);
  auVar4 = vsubps_avx(auVar4,*(undefined1 (*) [16])(prim + uVar78 * 0x19 + 6));
  auVar92._0_4_ = fVar87 * auVar4._0_4_;
  auVar92._4_4_ = fVar87 * auVar4._4_4_;
  auVar92._8_4_ = fVar87 * auVar4._8_4_;
  auVar92._12_4_ = fVar87 * auVar4._12_4_;
  auVar196._0_4_ = fVar87 * auVar5._0_4_;
  auVar196._4_4_ = fVar87 * auVar5._4_4_;
  auVar196._8_4_ = fVar87 * auVar5._8_4_;
  auVar196._12_4_ = fVar87 * auVar5._12_4_;
  auVar4 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 4 + 6)));
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 5 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 6 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xb + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xc + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xd + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x12 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x13 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar156 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x14 + 6)));
  auVar156 = vcvtdq2ps_avx(auVar156);
  auVar274._4_4_ = auVar196._0_4_;
  auVar274._0_4_ = auVar196._0_4_;
  auVar274._8_4_ = auVar196._0_4_;
  auVar274._12_4_ = auVar196._0_4_;
  auVar120 = vshufps_avx(auVar196,auVar196,0x55);
  auVar88 = vshufps_avx(auVar196,auVar196,0xaa);
  fVar87 = auVar88._0_4_;
  auVar251._0_4_ = fVar87 * auVar6._0_4_;
  fVar118 = auVar88._4_4_;
  auVar251._4_4_ = fVar118 * auVar6._4_4_;
  fVar195 = auVar88._8_4_;
  auVar251._8_4_ = fVar195 * auVar6._8_4_;
  fVar211 = auVar88._12_4_;
  auVar251._12_4_ = fVar211 * auVar6._12_4_;
  auVar242._0_4_ = auVar9._0_4_ * fVar87;
  auVar242._4_4_ = auVar9._4_4_ * fVar118;
  auVar242._8_4_ = auVar9._8_4_ * fVar195;
  auVar242._12_4_ = auVar9._12_4_ * fVar211;
  auVar229._0_4_ = auVar156._0_4_ * fVar87;
  auVar229._4_4_ = auVar156._4_4_ * fVar118;
  auVar229._8_4_ = auVar156._8_4_ * fVar195;
  auVar229._12_4_ = auVar156._12_4_ * fVar211;
  auVar88 = vfmadd231ps_fma(auVar251,auVar120,auVar5);
  auVar121 = vfmadd231ps_fma(auVar242,auVar120,auVar8);
  auVar120 = vfmadd231ps_fma(auVar229,auVar89,auVar120);
  auVar147 = vfmadd231ps_fma(auVar88,auVar274,auVar4);
  auVar121 = vfmadd231ps_fma(auVar121,auVar274,auVar7);
  auVar185 = vfmadd231ps_fma(auVar120,auVar90,auVar274);
  auVar275._4_4_ = auVar92._0_4_;
  auVar275._0_4_ = auVar92._0_4_;
  auVar275._8_4_ = auVar92._0_4_;
  auVar275._12_4_ = auVar92._0_4_;
  auVar279 = ZEXT1664(auVar275);
  auVar120 = vshufps_avx(auVar92,auVar92,0x55);
  auVar285 = ZEXT1664(auVar120);
  auVar88 = vshufps_avx(auVar92,auVar92,0xaa);
  fVar87 = auVar88._0_4_;
  auVar197._0_4_ = fVar87 * auVar6._0_4_;
  fVar118 = auVar88._4_4_;
  auVar197._4_4_ = fVar118 * auVar6._4_4_;
  fVar195 = auVar88._8_4_;
  auVar197._8_4_ = fVar195 * auVar6._8_4_;
  fVar211 = auVar88._12_4_;
  auVar197._12_4_ = fVar211 * auVar6._12_4_;
  auVar119._0_4_ = auVar9._0_4_ * fVar87;
  auVar119._4_4_ = auVar9._4_4_ * fVar118;
  auVar119._8_4_ = auVar9._8_4_ * fVar195;
  auVar119._12_4_ = auVar9._12_4_ * fVar211;
  auVar88._0_4_ = auVar156._0_4_ * fVar87;
  auVar88._4_4_ = auVar156._4_4_ * fVar118;
  auVar88._8_4_ = auVar156._8_4_ * fVar195;
  auVar88._12_4_ = auVar156._12_4_ * fVar211;
  auVar5 = vfmadd231ps_fma(auVar197,auVar120,auVar5);
  auVar6 = vfmadd231ps_fma(auVar119,auVar120,auVar8);
  auVar8 = vfmadd231ps_fma(auVar88,auVar120,auVar89);
  auVar9 = vfmadd231ps_fma(auVar5,auVar275,auVar4);
  auVar89 = vfmadd231ps_fma(auVar6,auVar275,auVar7);
  auVar156 = vfmadd231ps_fma(auVar8,auVar275,auVar90);
  auVar234._8_4_ = 0x7fffffff;
  auVar234._0_8_ = 0x7fffffff7fffffff;
  auVar234._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx(auVar147,auVar234);
  auVar184._8_4_ = 0x219392ef;
  auVar184._0_8_ = 0x219392ef219392ef;
  auVar184._12_4_ = 0x219392ef;
  auVar4 = vcmpps_avx(auVar4,auVar184,1);
  auVar5 = vblendvps_avx(auVar147,auVar184,auVar4);
  auVar4 = vandps_avx(auVar121,auVar234);
  auVar4 = vcmpps_avx(auVar4,auVar184,1);
  auVar6 = vblendvps_avx(auVar121,auVar184,auVar4);
  auVar4 = vandps_avx(auVar234,auVar185);
  auVar4 = vcmpps_avx(auVar4,auVar184,1);
  auVar4 = vblendvps_avx(auVar185,auVar184,auVar4);
  auVar7 = vrcpps_avx(auVar5);
  auVar230._8_4_ = 0x3f800000;
  auVar230._0_8_ = 0x3f8000003f800000;
  auVar230._12_4_ = 0x3f800000;
  auVar5 = vfnmadd213ps_fma(auVar5,auVar7,auVar230);
  auVar7 = vfmadd132ps_fma(auVar5,auVar7,auVar7);
  auVar5 = vrcpps_avx(auVar6);
  auVar6 = vfnmadd213ps_fma(auVar6,auVar5,auVar230);
  auVar8 = vfmadd132ps_fma(auVar6,auVar5,auVar5);
  auVar5 = vrcpps_avx(auVar4);
  auVar4 = vfnmadd213ps_fma(auVar4,auVar5,auVar230);
  auVar90 = vfmadd132ps_fma(auVar4,auVar5,auVar5);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar78 * 7 + 6);
  auVar4 = vpmovsxwd_avx(auVar4);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar9);
  auVar185._0_4_ = auVar7._0_4_ * auVar4._0_4_;
  auVar185._4_4_ = auVar7._4_4_ * auVar4._4_4_;
  auVar185._8_4_ = auVar7._8_4_ * auVar4._8_4_;
  auVar185._12_4_ = auVar7._12_4_ * auVar4._12_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar78 * 9 + 6);
  auVar4 = vpmovsxwd_avx(auVar5);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar9);
  auVar198._0_4_ = auVar7._0_4_ * auVar4._0_4_;
  auVar198._4_4_ = auVar7._4_4_ * auVar4._4_4_;
  auVar198._8_4_ = auVar7._8_4_ * auVar4._8_4_;
  auVar198._12_4_ = auVar7._12_4_ * auVar4._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar78 * 0xe + 6);
  auVar4 = vpmovsxwd_avx(auVar6);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar89);
  auVar218._0_4_ = auVar8._0_4_ * auVar4._0_4_;
  auVar218._4_4_ = auVar8._4_4_ * auVar4._4_4_;
  auVar218._8_4_ = auVar8._8_4_ * auVar4._8_4_;
  auVar218._12_4_ = auVar8._12_4_ * auVar4._12_4_;
  auVar121._1_3_ = 0;
  auVar121[0] = PVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar4 = vpmovsxwd_avx(auVar7);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar89);
  auVar120._0_4_ = auVar8._0_4_ * auVar4._0_4_;
  auVar120._4_4_ = auVar8._4_4_ * auVar4._4_4_;
  auVar120._8_4_ = auVar8._8_4_ * auVar4._8_4_;
  auVar120._12_4_ = auVar8._12_4_ * auVar4._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar78 * 0x15 + 6);
  auVar4 = vpmovsxwd_avx(auVar8);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar156);
  auVar147._0_4_ = auVar90._0_4_ * auVar4._0_4_;
  auVar147._4_4_ = auVar90._4_4_ * auVar4._4_4_;
  auVar147._8_4_ = auVar90._8_4_ * auVar4._8_4_;
  auVar147._12_4_ = auVar90._12_4_ * auVar4._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar78 * 0x17 + 6);
  auVar4 = vpmovsxwd_avx(auVar9);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar156);
  auVar89._0_4_ = auVar90._0_4_ * auVar4._0_4_;
  auVar89._4_4_ = auVar90._4_4_ * auVar4._4_4_;
  auVar89._8_4_ = auVar90._8_4_ * auVar4._8_4_;
  auVar89._12_4_ = auVar90._12_4_ * auVar4._12_4_;
  auVar4 = vpminsd_avx(auVar185,auVar198);
  auVar5 = vpminsd_avx(auVar218,auVar120);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  auVar5 = vpminsd_avx(auVar147,auVar89);
  uVar84 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar243._4_4_ = uVar84;
  auVar243._0_4_ = uVar84;
  auVar243._8_4_ = uVar84;
  auVar243._12_4_ = uVar84;
  auVar5 = vmaxps_avx(auVar5,auVar243);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  local_640._0_4_ = auVar4._0_4_ * 0.99999964;
  local_640._4_4_ = auVar4._4_4_ * 0.99999964;
  local_640._8_4_ = auVar4._8_4_ * 0.99999964;
  local_640._12_4_ = auVar4._12_4_ * 0.99999964;
  auVar4 = vpmaxsd_avx(auVar185,auVar198);
  auVar5 = vpmaxsd_avx(auVar218,auVar120);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar5 = vpmaxsd_avx(auVar147,auVar89);
  uVar84 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar156._4_4_ = uVar84;
  auVar156._0_4_ = uVar84;
  auVar156._8_4_ = uVar84;
  auVar156._12_4_ = uVar84;
  auVar5 = vminps_avx(auVar5,auVar156);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar90._0_4_ = auVar4._0_4_ * 1.0000004;
  auVar90._4_4_ = auVar4._4_4_ * 1.0000004;
  auVar90._8_4_ = auVar4._8_4_ * 1.0000004;
  auVar90._12_4_ = auVar4._12_4_ * 1.0000004;
  auVar121[4] = PVar1;
  auVar121._5_3_ = 0;
  auVar121[8] = PVar1;
  auVar121._9_3_ = 0;
  auVar121[0xc] = PVar1;
  auVar121._13_3_ = 0;
  auVar5 = vpcmpgtd_avx(auVar121,_DAT_01f4ad30);
  auVar4 = vcmpps_avx(local_640,auVar90,2);
  auVar4 = vandps_avx(auVar4,auVar5);
  uVar84 = vmovmskps_avx(auVar4);
  local_8c8 = CONCAT44((int)((ulong)in_R11 >> 0x20),uVar84);
  auVar102._16_16_ = mm_lookupmask_ps._240_16_;
  auVar102._0_16_ = mm_lookupmask_ps._240_16_;
  local_600 = vblendps_avx(auVar102,ZEXT832(0) << 0x20,0x80);
  auVar250 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  local_8d8 = prim;
LAB_0116aaf0:
  if (local_8c8 == 0) {
LAB_0116d38a:
    return local_8c8 != 0;
  }
  lVar80 = 0;
  for (uVar78 = local_8c8; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
    lVar80 = lVar80 + 1;
  }
  uVar77 = *(uint *)(local_8d8 + 2);
  local_7c0 = *(uint *)(local_8d8 + lVar80 * 4 + 6);
  pGVar2 = (context->scene->geometries).items[uVar77].ptr;
  uVar78 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_7c0);
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar80 = *(long *)&pGVar2[1].time_range.upper;
  auVar4 = *(undefined1 (*) [16])(lVar80 + (long)p_Var3 * uVar78);
  auVar5 = *(undefined1 (*) [16])(lVar80 + (uVar78 + 1) * (long)p_Var3);
  local_8d0 = local_8c8 - 1 & local_8c8;
  if (local_8d0 != 0) {
    uVar83 = local_8d0 - 1 & local_8d0;
    for (uVar79 = local_8d0; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
    }
    if (uVar83 != 0) {
      for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar7 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar84 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar258._4_4_ = uVar84;
  auVar258._0_4_ = uVar84;
  auVar258._8_4_ = uVar84;
  auVar258._12_4_ = uVar84;
  fStack_870 = (float)uVar84;
  _local_880 = auVar258;
  fStack_86c = (float)uVar84;
  fStack_868 = (float)uVar84;
  register0x000014dc = uVar84;
  uVar84 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar269._4_4_ = uVar84;
  auVar269._0_4_ = uVar84;
  auVar269._8_4_ = uVar84;
  auVar269._12_4_ = uVar84;
  fStack_6d0 = (float)uVar84;
  _local_6e0 = auVar269;
  fStack_6cc = (float)uVar84;
  fStack_6c8 = (float)uVar84;
  register0x0000155c = uVar84;
  auVar6 = vunpcklps_avx(auVar258,auVar269);
  fVar87 = *(float *)(ray + k * 4 + 0x60);
  auVar262._4_4_ = fVar87;
  auVar262._0_4_ = fVar87;
  auVar262._8_4_ = fVar87;
  auVar262._12_4_ = fVar87;
  fStack_890 = fVar87;
  _local_8a0 = auVar262;
  fStack_88c = fVar87;
  fStack_888 = fVar87;
  register0x0000151c = fVar87;
  auVar266 = ZEXT3264(_local_8a0);
  local_950 = vinsertps_avx(auVar6,auVar262,0x28);
  auVar238 = ZEXT1664(local_950);
  auVar199._0_4_ = (auVar4._0_4_ + auVar5._0_4_) * 0.5;
  auVar199._4_4_ = (auVar4._4_4_ + auVar5._4_4_) * 0.5;
  auVar199._8_4_ = (auVar4._8_4_ + auVar5._8_4_) * 0.5;
  auVar199._12_4_ = (auVar4._12_4_ + auVar5._12_4_) * 0.5;
  auVar6 = vsubps_avx(auVar199,auVar7);
  auVar6 = vdpps_avx(auVar6,local_950,0x7f);
  local_960 = vdpps_avx(local_950,local_950,0x7f);
  auVar257 = ZEXT1664(local_960);
  auVar8 = vrcpss_avx(local_960,local_960);
  auVar9 = vfnmadd213ss_fma(auVar8,local_960,ZEXT416(0x40000000));
  auVar232 = ZEXT1664(auVar9);
  local_360 = auVar6._0_4_ * auVar8._0_4_ * auVar9._0_4_;
  auVar219._4_4_ = local_360;
  auVar219._0_4_ = local_360;
  auVar219._8_4_ = local_360;
  auVar219._12_4_ = local_360;
  fStack_8b0 = local_360;
  _local_8c0 = auVar219;
  fStack_8ac = local_360;
  fStack_8a8 = local_360;
  fStack_8a4 = local_360;
  auVar6 = vfmadd231ps_fma(auVar7,local_950,auVar219);
  auVar6 = vblendps_avx(auVar6,_DAT_01f45a50,8);
  auVar7 = vsubps_avx(auVar4,auVar6);
  auVar8 = vsubps_avx(*(undefined1 (*) [16])(lVar80 + (uVar78 + 2) * (long)p_Var3),auVar6);
  auVar9 = vsubps_avx(auVar5,auVar6);
  auVar6 = vsubps_avx(*(undefined1 (*) [16])(lVar80 + (uVar78 + 3) * (long)p_Var3),auVar6);
  auVar4 = vmovshdup_avx(auVar7);
  local_1e0 = auVar4._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar4 = vshufps_avx(auVar7,auVar7,0xaa);
  local_200 = auVar4._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar4 = vshufps_avx(auVar7,auVar7,0xff);
  local_220 = auVar4._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar4 = vmovshdup_avx(auVar9);
  local_480 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar9,auVar9,0xaa);
  local_4a0 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar9,auVar9,0xff);
  local_4c0 = auVar4._0_8_;
  auVar4 = vmovshdup_avx(auVar8);
  local_4e0 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar8,auVar8,0xaa);
  local_500 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar8,auVar8,0xff);
  local_520 = auVar4._0_8_;
  auVar4 = vmovshdup_avx(auVar6);
  local_540 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar6,auVar6,0xaa);
  local_560 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar6,auVar6,0xff);
  local_580 = auVar4._0_8_;
  auVar4 = vfmadd231ps_fma(ZEXT432((uint)(fVar87 * fVar87)),_local_6e0,_local_6e0);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),_local_880,_local_880);
  uVar84 = auVar4._0_4_;
  local_240._4_4_ = uVar84;
  local_240._0_4_ = uVar84;
  local_240._8_4_ = uVar84;
  local_240._12_4_ = uVar84;
  local_240._16_4_ = uVar84;
  local_240._20_4_ = uVar84;
  local_240._24_4_ = uVar84;
  local_240._28_4_ = uVar84;
  fVar87 = *(float *)(ray + k * 4 + 0x30);
  local_900 = ZEXT416((uint)local_360);
  local_360 = fVar87 - local_360;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  uVar78 = 0;
  bVar82 = 0;
  local_c04 = 1;
  local_260 = auVar7._0_4_;
  uStack_25c = local_260;
  uStack_258 = local_260;
  uStack_254 = local_260;
  uStack_250 = local_260;
  uStack_24c = local_260;
  uStack_248 = local_260;
  uStack_244 = local_260;
  local_5a0 = auVar9._0_4_;
  local_5c0 = auVar8._0_4_;
  fVar118 = auVar6._0_4_;
  local_700._8_4_ = 0x7fffffff;
  local_700._0_8_ = 0x7fffffff7fffffff;
  local_700._12_4_ = 0x7fffffff;
  local_700._16_4_ = 0x7fffffff;
  local_700._20_4_ = 0x7fffffff;
  local_700._24_4_ = 0x7fffffff;
  local_700._28_4_ = 0x7fffffff;
  local_620 = vandps_avx(local_240,local_700);
  auVar4 = vsqrtss_avx(local_960,local_960);
  auVar5 = vsqrtss_avx(local_960,local_960);
  local_630 = ZEXT816(0x3f80000000000000);
  uStack_7bc = local_7c0;
  uStack_7b8 = local_7c0;
  uStack_7b4 = local_7c0;
  local_7b0 = uVar77;
  uStack_7ac = uVar77;
  uStack_7a8 = uVar77;
  uStack_7a4 = uVar77;
  local_5e0 = fVar118;
  fStack_5dc = fVar118;
  fStack_5d8 = fVar118;
  fStack_5d4 = fVar118;
  fStack_5d0 = fVar118;
  fStack_5cc = fVar118;
  fStack_5c8 = fVar118;
  fStack_5c4 = fVar118;
  uStack_5bc = local_5c0;
  uStack_5b8 = local_5c0;
  uStack_5b4 = local_5c0;
  uStack_5b0 = local_5c0;
  uStack_5ac = local_5c0;
  uStack_5a8 = local_5c0;
  uStack_5a4 = local_5c0;
  uStack_59c = local_5a0;
  uStack_598 = local_5a0;
  uStack_594 = local_5a0;
  uStack_590 = local_5a0;
  uStack_58c = local_5a0;
  uStack_588 = local_5a0;
  uStack_584 = local_5a0;
  uStack_578 = local_580;
  uStack_570 = local_580;
  uStack_568 = local_580;
  uStack_558 = local_560;
  uStack_550 = local_560;
  uStack_548 = local_560;
  uStack_538 = local_540;
  uStack_530 = local_540;
  uStack_528 = local_540;
  uStack_518 = local_520;
  uStack_510 = local_520;
  uStack_508 = local_520;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  do {
    auVar90 = vmovshdup_avx(local_630);
    auVar90 = vsubps_avx(auVar90,local_630);
    auVar103._0_4_ = auVar90._0_4_;
    fVar183 = auVar103._0_4_ * 0.04761905;
    uVar84 = local_630._0_4_;
    local_800._4_4_ = uVar84;
    local_800._0_4_ = uVar84;
    local_800._8_4_ = uVar84;
    local_800._12_4_ = uVar84;
    local_800._16_4_ = uVar84;
    local_800._20_4_ = uVar84;
    local_800._24_4_ = uVar84;
    local_800._28_4_ = uVar84;
    auVar103._4_4_ = auVar103._0_4_;
    auVar103._8_4_ = auVar103._0_4_;
    auVar103._12_4_ = auVar103._0_4_;
    auVar103._16_4_ = auVar103._0_4_;
    auVar103._20_4_ = auVar103._0_4_;
    auVar103._24_4_ = auVar103._0_4_;
    auVar103._28_4_ = auVar103._0_4_;
    auVar90 = vfmadd231ps_fma(local_800,auVar103,_DAT_01f7b040);
    auVar102 = vsubps_avx(auVar250._0_32_,ZEXT1632(auVar90));
    fVar195 = auVar90._0_4_;
    fVar212 = auVar90._4_4_;
    fVar214 = auVar90._8_4_;
    fVar216 = auVar90._12_4_;
    auVar286._28_36_ = auVar285._28_36_;
    auVar286._0_28_ =
         ZEXT1628(CONCAT412(fVar216 * fVar216,
                            CONCAT48(fVar214 * fVar214,CONCAT44(fVar212 * fVar212,fVar195 * fVar195)
                                    )));
    fVar233 = fVar195 * 3.0;
    fVar239 = fVar212 * 3.0;
    fVar240 = fVar214 * 3.0;
    fVar241 = fVar216 * 3.0;
    fVar211 = auVar102._0_4_;
    auVar250._0_4_ = fVar211 * fVar211;
    fVar213 = auVar102._4_4_;
    auVar250._4_4_ = fVar213 * fVar213;
    fVar215 = auVar102._8_4_;
    auVar250._8_4_ = fVar215 * fVar215;
    fVar179 = auVar102._12_4_;
    auVar250._12_4_ = fVar179 * fVar179;
    fVar180 = auVar102._16_4_;
    auVar250._16_4_ = fVar180 * fVar180;
    fVar181 = auVar102._20_4_;
    auVar250._20_4_ = fVar181 * fVar181;
    fVar182 = auVar102._24_4_;
    auVar250._28_36_ = auVar257._28_36_;
    auVar250._24_4_ = fVar182 * fVar182;
    auVar285._0_4_ = (auVar250._0_4_ * (fVar211 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar285._4_4_ = (auVar250._4_4_ * (fVar213 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar285._8_4_ = (auVar250._8_4_ * (fVar215 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar285._12_4_ = (auVar250._12_4_ * (fVar179 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar285._16_4_ = (auVar250._16_4_ * (fVar180 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar285._20_4_ = (auVar250._20_4_ * (fVar181 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar285._28_36_ = auVar266._28_36_;
    auVar285._24_4_ = (auVar250._24_4_ * (fVar182 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar263 = auVar285._0_32_;
    fVar217 = fVar195 * fVar195 * -fVar211 * 0.5;
    fVar223 = fVar212 * fVar212 * -fVar213 * 0.5;
    fVar224 = fVar214 * fVar214 * -fVar215 * 0.5;
    fVar225 = fVar216 * fVar216 * -fVar179 * 0.5;
    fVar226 = -fVar180 * 0.0 * 0.0 * 0.5;
    fVar227 = -fVar181 * 0.0 * 0.0 * 0.5;
    fVar228 = -fVar182 * 0.0 * 0.0 * 0.5;
    auVar11._4_4_ = fVar223 * fStack_5dc;
    auVar11._0_4_ = fVar217 * local_5e0;
    auVar11._8_4_ = fVar224 * fStack_5d8;
    auVar11._12_4_ = fVar225 * fStack_5d4;
    auVar11._16_4_ = fVar226 * fStack_5d0;
    auVar11._20_4_ = fVar227 * fStack_5cc;
    auVar11._24_4_ = fVar228 * fStack_5c8;
    auVar11._28_4_ = auVar102._28_4_ ^ 0x80000000;
    auVar257._0_4_ = fVar217 * (float)local_540;
    auVar257._4_4_ = fVar223 * local_540._4_4_;
    auVar257._8_4_ = fVar224 * (float)uStack_538;
    auVar257._12_4_ = fVar225 * uStack_538._4_4_;
    auVar257._16_4_ = fVar226 * (float)uStack_530;
    auVar257._20_4_ = fVar227 * uStack_530._4_4_;
    auVar257._28_36_ = auVar279._28_36_;
    auVar257._24_4_ = fVar228 * (float)uStack_528;
    auVar161._0_4_ = fVar217 * (float)local_560;
    auVar161._4_4_ = fVar223 * local_560._4_4_;
    auVar161._8_4_ = fVar224 * (float)uStack_558;
    auVar161._12_4_ = fVar225 * uStack_558._4_4_;
    auVar161._16_4_ = fVar226 * (float)uStack_550;
    auVar161._20_4_ = fVar227 * uStack_550._4_4_;
    auVar161._24_4_ = fVar228 * (float)uStack_548;
    auVar161._28_4_ = 0;
    auVar12._4_4_ = fVar223 * local_580._4_4_;
    auVar12._0_4_ = fVar217 * (float)local_580;
    auVar12._8_4_ = fVar224 * (float)uStack_578;
    auVar12._12_4_ = fVar225 * uStack_578._4_4_;
    auVar12._16_4_ = fVar226 * (float)uStack_570;
    auVar12._20_4_ = fVar227 * uStack_570._4_4_;
    auVar12._24_4_ = fVar228 * (float)uStack_568;
    auVar12._28_4_ = auVar232._28_4_ + -5.0 + 2.0;
    auVar104._4_4_ = uStack_5bc;
    auVar104._0_4_ = local_5c0;
    auVar104._8_4_ = uStack_5b8;
    auVar104._12_4_ = uStack_5b4;
    auVar104._16_4_ = uStack_5b0;
    auVar104._20_4_ = uStack_5ac;
    auVar104._24_4_ = uStack_5a8;
    auVar104._28_4_ = uStack_5a4;
    auVar90 = vfmadd231ps_fma(auVar11,auVar263,auVar104);
    auVar61._8_8_ = uStack_4d8;
    auVar61._0_8_ = local_4e0;
    auVar61._16_8_ = uStack_4d0;
    auVar61._24_8_ = uStack_4c8;
    auVar89 = vfmadd231ps_fma(auVar257._0_32_,auVar263,auVar61);
    auVar59._8_8_ = uStack_4f8;
    auVar59._0_8_ = local_500;
    auVar59._16_8_ = uStack_4f0;
    auVar59._24_8_ = uStack_4e8;
    auVar156 = vfmadd231ps_fma(auVar161,auVar263,auVar59);
    auVar57._8_8_ = uStack_518;
    auVar57._0_8_ = local_520;
    auVar57._16_8_ = uStack_510;
    auVar57._24_8_ = uStack_508;
    auVar120 = vfmadd231ps_fma(auVar12,auVar263,auVar57);
    auVar263._4_4_ = (fVar212 * fVar212 * (fVar239 + -5.0) + 2.0) * 0.5;
    auVar263._0_4_ = (fVar195 * fVar195 * (fVar233 + -5.0) + 2.0) * 0.5;
    auVar263._8_4_ = (fVar214 * fVar214 * (fVar240 + -5.0) + 2.0) * 0.5;
    auVar263._12_4_ = (fVar216 * fVar216 * (fVar241 + -5.0) + 2.0) * 0.5;
    auVar263._16_4_ = 0x3f800000;
    auVar263._20_4_ = 0x3f800000;
    auVar263._24_4_ = 0x3f800000;
    auVar263._28_4_ = auVar266._28_4_ + 2.0;
    auVar55._4_4_ = uStack_59c;
    auVar55._0_4_ = local_5a0;
    auVar55._8_4_ = uStack_598;
    auVar55._12_4_ = uStack_594;
    auVar55._16_4_ = uStack_590;
    auVar55._20_4_ = uStack_58c;
    auVar55._24_4_ = uStack_588;
    auVar55._28_4_ = uStack_584;
    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar263,auVar55);
    auVar67._8_8_ = uStack_478;
    auVar67._0_8_ = local_480;
    auVar67._16_8_ = uStack_470;
    auVar67._24_8_ = uStack_468;
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar263,auVar67);
    auVar65._8_8_ = uStack_498;
    auVar65._0_8_ = local_4a0;
    auVar65._16_8_ = uStack_490;
    auVar65._24_8_ = uStack_488;
    auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar263,auVar65);
    auVar63._8_8_ = uStack_4b8;
    auVar63._0_8_ = local_4c0;
    auVar63._16_8_ = uStack_4b0;
    auVar63._24_8_ = uStack_4a8;
    auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar263,auVar63);
    local_860._8_4_ = 0x80000000;
    local_860._0_8_ = 0x8000000080000000;
    local_860._12_4_ = 0x80000000;
    uStack_850 = 0x80000000;
    uStack_84c = 0x80000000;
    uStack_848 = 0x80000000;
    uStack_844 = 0x80000000;
    auVar13._4_4_ = -fVar212 * fVar213 * fVar213 * 0.5;
    auVar13._0_4_ = -fVar195 * fVar211 * fVar211 * 0.5;
    auVar13._8_4_ = -fVar214 * fVar215 * fVar215 * 0.5;
    auVar13._12_4_ = -fVar216 * fVar179 * fVar179 * 0.5;
    auVar13._16_4_ = fVar180 * -0.0 * fVar180 * 0.5;
    auVar13._20_4_ = fVar181 * -0.0 * fVar181 * 0.5;
    auVar13._24_4_ = fVar182 * -0.0 * fVar182 * 0.5;
    auVar13._28_4_ = 0x80000000;
    auVar72._4_4_ = uStack_25c;
    auVar72._0_4_ = local_260;
    auVar72._8_4_ = uStack_258;
    auVar72._12_4_ = uStack_254;
    auVar72._16_4_ = uStack_250;
    auVar72._20_4_ = uStack_24c;
    auVar72._24_4_ = uStack_248;
    auVar72._28_4_ = uStack_244;
    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar13,auVar72);
    auVar75._8_8_ = uStack_1d8;
    auVar75._0_8_ = local_1e0;
    auVar75._16_8_ = uStack_1d0;
    auVar75._24_8_ = uStack_1c8;
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar13,auVar75);
    auVar74._8_8_ = uStack_1f8;
    auVar74._0_8_ = local_200;
    auVar74._16_8_ = uStack_1f0;
    auVar74._24_8_ = uStack_1e8;
    auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar13,auVar74);
    auVar73._8_8_ = uStack_218;
    auVar73._0_8_ = local_220;
    auVar73._16_8_ = uStack_210;
    auVar73._24_8_ = uStack_208;
    auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar73,auVar13);
    auVar104 = ZEXT1632(auVar120);
    auVar202._0_4_ = (fVar211 + fVar211) * fVar195;
    auVar202._4_4_ = (fVar213 + fVar213) * fVar212;
    auVar202._8_4_ = (fVar215 + fVar215) * fVar214;
    auVar202._12_4_ = (fVar179 + fVar179) * fVar216;
    auVar202._16_4_ = (fVar180 + fVar180) * 0.0;
    auVar202._20_4_ = (fVar181 + fVar181) * 0.0;
    auVar202._24_4_ = (fVar182 + fVar182) * 0.0;
    auVar202._28_4_ = 0;
    auVar11 = vsubps_avx(auVar202,auVar250._0_32_);
    fVar217 = auVar238._28_4_ + 2.0;
    auVar208._4_4_ = (fVar213 + fVar213) * (fVar239 + 2.0);
    auVar208._0_4_ = (fVar211 + fVar211) * (fVar233 + 2.0);
    auVar208._8_4_ = (fVar215 + fVar215) * (fVar240 + 2.0);
    auVar208._12_4_ = (fVar179 + fVar179) * (fVar241 + 2.0);
    auVar208._16_4_ = (fVar180 + fVar180) * 2.0;
    auVar208._20_4_ = (fVar181 + fVar181) * 2.0;
    auVar208._24_4_ = (fVar182 + fVar182) * 2.0;
    auVar208._28_4_ = fVar217;
    auVar111._4_4_ = fVar213 * fVar213 * 3.0;
    auVar111._0_4_ = fVar211 * fVar211 * 3.0;
    auVar111._8_4_ = fVar215 * fVar215 * 3.0;
    auVar111._12_4_ = fVar179 * fVar179 * 3.0;
    auVar111._16_4_ = fVar180 * fVar180 * 3.0;
    auVar111._20_4_ = fVar181 * fVar181 * 3.0;
    auVar111._24_4_ = fVar182 * fVar182 * 3.0;
    auVar111._28_4_ = auVar102._28_4_;
    auVar102 = vsubps_avx(auVar208,auVar111);
    auVar12 = vsubps_avx(auVar286._0_32_,auVar202);
    auVar134._4_4_ = auVar11._4_4_ * 0.5;
    auVar134._0_4_ = auVar11._0_4_ * 0.5;
    auVar134._8_4_ = auVar11._8_4_ * 0.5;
    auVar134._12_4_ = auVar11._12_4_ * 0.5;
    auVar134._16_4_ = auVar11._16_4_ * 0.5;
    auVar134._20_4_ = auVar11._20_4_ * 0.5;
    auVar134._24_4_ = auVar11._24_4_ * 0.5;
    auVar134._28_4_ = auVar232._28_4_;
    auVar207._28_4_ = fVar217;
    auVar207._0_28_ =
         ZEXT1628(CONCAT412((fVar241 * fVar216 + (fVar216 + fVar216) * (fVar241 + -5.0)) * 0.5,
                            CONCAT48((fVar240 * fVar214 + (fVar214 + fVar214) * (fVar240 + -5.0)) *
                                     0.5,CONCAT44((fVar239 * fVar212 +
                                                  (fVar212 + fVar212) * (fVar239 + -5.0)) * 0.5,
                                                  (fVar233 * fVar195 +
                                                  (fVar195 + fVar195) * (fVar233 + -5.0)) * 0.5))));
    auVar15._4_4_ = auVar102._4_4_ * 0.5;
    auVar15._0_4_ = auVar102._0_4_ * 0.5;
    auVar15._8_4_ = auVar102._8_4_ * 0.5;
    auVar15._12_4_ = auVar102._12_4_ * 0.5;
    auVar15._16_4_ = auVar102._16_4_ * 0.5;
    auVar15._20_4_ = auVar102._20_4_ * 0.5;
    auVar15._24_4_ = auVar102._24_4_ * 0.5;
    auVar15._28_4_ = auVar102._28_4_;
    fVar195 = auVar12._0_4_ * 0.5;
    fVar211 = auVar12._4_4_ * 0.5;
    fVar212 = auVar12._8_4_ * 0.5;
    fVar213 = auVar12._12_4_ * 0.5;
    fVar214 = auVar12._16_4_ * 0.5;
    fVar215 = auVar12._20_4_ * 0.5;
    fVar216 = auVar12._24_4_ * 0.5;
    auVar16._4_4_ = fVar211 * fStack_5dc;
    auVar16._0_4_ = fVar195 * local_5e0;
    auVar16._8_4_ = fVar212 * fStack_5d8;
    auVar16._12_4_ = fVar213 * fStack_5d4;
    auVar16._16_4_ = fVar214 * fStack_5d0;
    auVar16._20_4_ = fVar215 * fStack_5cc;
    auVar16._24_4_ = fVar216 * fStack_5c8;
    auVar16._28_4_ = 0x3f000000;
    auVar17._4_4_ = fVar211 * local_540._4_4_;
    auVar17._0_4_ = fVar195 * (float)local_540;
    auVar17._8_4_ = fVar212 * (float)uStack_538;
    auVar17._12_4_ = fVar213 * uStack_538._4_4_;
    auVar17._16_4_ = fVar214 * (float)uStack_530;
    auVar17._20_4_ = fVar215 * uStack_530._4_4_;
    auVar17._24_4_ = fVar216 * (float)uStack_528;
    auVar17._28_4_ = auVar11._28_4_;
    auVar18._4_4_ = fVar211 * local_560._4_4_;
    auVar18._0_4_ = fVar195 * (float)local_560;
    auVar18._8_4_ = fVar212 * (float)uStack_558;
    auVar18._12_4_ = fVar213 * uStack_558._4_4_;
    auVar18._16_4_ = fVar214 * (float)uStack_550;
    auVar18._20_4_ = fVar215 * uStack_550._4_4_;
    auVar18._24_4_ = fVar216 * (float)uStack_548;
    auVar18._28_4_ = auVar238._28_4_ + -5.0 + 0.0;
    auVar19._4_4_ = fVar211 * local_580._4_4_;
    auVar19._0_4_ = fVar195 * (float)local_580;
    auVar19._8_4_ = fVar212 * (float)uStack_578;
    auVar19._12_4_ = fVar213 * uStack_578._4_4_;
    auVar19._16_4_ = fVar214 * (float)uStack_570;
    auVar19._20_4_ = fVar215 * uStack_570._4_4_;
    auVar19._24_4_ = fVar216 * (float)uStack_568;
    auVar19._28_4_ = auVar12._28_4_;
    auVar132._4_4_ = uStack_5bc;
    auVar132._0_4_ = local_5c0;
    auVar132._8_4_ = uStack_5b8;
    auVar132._12_4_ = uStack_5b4;
    auVar132._16_4_ = uStack_5b0;
    auVar132._20_4_ = uStack_5ac;
    auVar132._24_4_ = uStack_5a8;
    auVar132._28_4_ = uStack_5a4;
    auVar88 = vfmadd231ps_fma(auVar16,auVar15,auVar132);
    auVar62._8_8_ = uStack_4d8;
    auVar62._0_8_ = local_4e0;
    auVar62._16_8_ = uStack_4d0;
    auVar62._24_8_ = uStack_4c8;
    auVar121 = vfmadd231ps_fma(auVar17,auVar15,auVar62);
    auVar60._8_8_ = uStack_4f8;
    auVar60._0_8_ = local_500;
    auVar60._16_8_ = uStack_4f0;
    auVar60._24_8_ = uStack_4e8;
    auVar147 = vfmadd231ps_fma(auVar18,auVar15,auVar60);
    auVar58._8_8_ = uStack_518;
    auVar58._0_8_ = local_520;
    auVar58._16_8_ = uStack_510;
    auVar58._24_8_ = uStack_508;
    auVar185 = vfmadd231ps_fma(auVar19,auVar15,auVar58);
    auVar56._4_4_ = uStack_59c;
    auVar56._0_4_ = local_5a0;
    auVar56._8_4_ = uStack_598;
    auVar56._12_4_ = uStack_594;
    auVar56._16_4_ = uStack_590;
    auVar56._20_4_ = uStack_58c;
    auVar56._24_4_ = uStack_588;
    auVar56._28_4_ = uStack_584;
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar207,auVar56);
    auVar68._8_8_ = uStack_478;
    auVar68._0_8_ = local_480;
    auVar68._16_8_ = uStack_470;
    auVar68._24_8_ = uStack_468;
    auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar207,auVar68);
    auVar66._8_8_ = uStack_498;
    auVar66._0_8_ = local_4a0;
    auVar66._16_8_ = uStack_490;
    auVar66._24_8_ = uStack_488;
    auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar207,auVar66);
    auVar64._8_8_ = uStack_4b8;
    auVar64._0_8_ = local_4c0;
    auVar64._16_8_ = uStack_4b0;
    auVar64._24_8_ = uStack_4a8;
    auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar207,auVar64);
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar134,auVar72);
    auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar134,auVar75);
    auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar134,auVar74);
    auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar73,auVar134);
    local_7e0._0_4_ = auVar88._0_4_ * fVar183;
    local_7e0._4_4_ = auVar88._4_4_ * fVar183;
    local_7e0._8_4_ = auVar88._8_4_ * fVar183;
    local_7e0._12_4_ = auVar88._12_4_ * fVar183;
    local_7e0._16_4_ = fVar183 * 0.0;
    local_7e0._20_4_ = fVar183 * 0.0;
    local_7e0._24_4_ = fVar183 * 0.0;
    local_7e0._28_4_ = 0;
    auVar254._0_4_ = auVar121._0_4_ * fVar183;
    auVar254._4_4_ = auVar121._4_4_ * fVar183;
    auVar254._8_4_ = auVar121._8_4_ * fVar183;
    auVar254._12_4_ = auVar121._12_4_ * fVar183;
    auVar254._16_4_ = fVar183 * 0.0;
    auVar254._20_4_ = fVar183 * 0.0;
    auVar254._24_4_ = fVar183 * 0.0;
    auVar254._28_4_ = 0;
    auVar259._0_4_ = auVar147._0_4_ * fVar183;
    auVar259._4_4_ = auVar147._4_4_ * fVar183;
    auVar259._8_4_ = auVar147._8_4_ * fVar183;
    auVar259._12_4_ = auVar147._12_4_ * fVar183;
    auVar259._16_4_ = fVar183 * 0.0;
    auVar259._20_4_ = fVar183 * 0.0;
    auVar259._24_4_ = fVar183 * 0.0;
    auVar259._28_4_ = 0;
    fVar195 = fVar183 * auVar185._0_4_;
    fVar211 = fVar183 * auVar185._4_4_;
    auVar206._4_4_ = fVar211;
    auVar206._0_4_ = fVar195;
    fVar212 = fVar183 * auVar185._8_4_;
    auVar206._8_4_ = fVar212;
    fVar213 = fVar183 * auVar185._12_4_;
    auVar206._12_4_ = fVar213;
    auVar206._16_4_ = fVar183 * 0.0;
    auVar206._20_4_ = fVar183 * 0.0;
    auVar206._24_4_ = fVar183 * 0.0;
    auVar206._28_4_ = fVar183;
    auVar132 = ZEXT1632(auVar90);
    auVar207 = vpermps_avx2(_DAT_01fb7720,auVar132);
    auVar15 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar156));
    local_2e0 = vsubps_avx(auVar207,ZEXT1632(auVar90));
    local_2c0 = vsubps_avx(auVar15,ZEXT1632(auVar156));
    fVar179 = local_2c0._0_4_;
    fVar180 = local_2c0._4_4_;
    auVar264._4_4_ = fVar180 * local_7e0._4_4_;
    auVar264._0_4_ = fVar179 * (float)local_7e0._0_4_;
    fVar181 = local_2c0._8_4_;
    auVar264._8_4_ = fVar181 * local_7e0._8_4_;
    fVar182 = local_2c0._12_4_;
    auVar264._12_4_ = fVar182 * local_7e0._12_4_;
    fVar217 = local_2c0._16_4_;
    auVar264._16_4_ = fVar217 * local_7e0._16_4_;
    fVar223 = local_2c0._20_4_;
    auVar264._20_4_ = fVar223 * local_7e0._20_4_;
    fVar240 = local_2c0._24_4_;
    auVar264._24_4_ = fVar240 * local_7e0._24_4_;
    auVar264._28_4_ = auVar15._28_4_;
    auVar90 = vfmsub231ps_fma(auVar264,auVar259,local_2e0);
    local_920 = ZEXT1632(auVar89);
    auVar16 = vpermps_avx2(_DAT_01fb7720,local_920);
    local_300 = vsubps_avx(auVar16,ZEXT1632(auVar89));
    fVar241 = local_2e0._0_4_;
    fVar267 = local_2e0._4_4_;
    auVar276._4_4_ = fVar267 * auVar254._4_4_;
    auVar276._0_4_ = fVar241 * auVar254._0_4_;
    fVar268 = local_2e0._8_4_;
    auVar276._8_4_ = fVar268 * auVar254._8_4_;
    fVar270 = local_2e0._12_4_;
    auVar276._12_4_ = fVar270 * auVar254._12_4_;
    fVar271 = local_2e0._16_4_;
    auVar276._16_4_ = fVar271 * auVar254._16_4_;
    fVar272 = local_2e0._20_4_;
    auVar276._20_4_ = fVar272 * auVar254._20_4_;
    fVar273 = local_2e0._24_4_;
    auVar276._24_4_ = fVar273 * auVar254._24_4_;
    auVar276._28_4_ = auVar16._28_4_;
    auVar89 = vfmsub231ps_fma(auVar276,local_7e0,local_300);
    auVar90 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar89._12_4_ * auVar89._12_4_,
                                                 CONCAT48(auVar89._8_4_ * auVar89._8_4_,
                                                          CONCAT44(auVar89._4_4_ * auVar89._4_4_,
                                                                   auVar89._0_4_ * auVar89._0_4_))))
                              ,ZEXT1632(auVar90),ZEXT1632(auVar90));
    fVar224 = local_300._0_4_;
    auVar203._0_4_ = fVar224 * auVar259._0_4_;
    fVar225 = local_300._4_4_;
    auVar203._4_4_ = fVar225 * auVar259._4_4_;
    fVar226 = local_300._8_4_;
    auVar203._8_4_ = fVar226 * auVar259._8_4_;
    fVar227 = local_300._12_4_;
    auVar203._12_4_ = fVar227 * auVar259._12_4_;
    fVar228 = local_300._16_4_;
    auVar203._16_4_ = fVar228 * auVar259._16_4_;
    fVar233 = local_300._20_4_;
    auVar203._20_4_ = fVar233 * auVar259._20_4_;
    fVar239 = local_300._24_4_;
    auVar203._24_4_ = fVar239 * auVar259._24_4_;
    auVar203._28_4_ = 0;
    auVar89 = vfmsub231ps_fma(auVar203,auVar254,local_2c0);
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar90),ZEXT1632(auVar89),ZEXT1632(auVar89));
    auVar204._0_4_ = fVar179 * fVar179;
    auVar204._4_4_ = fVar180 * fVar180;
    auVar204._8_4_ = fVar181 * fVar181;
    auVar204._12_4_ = fVar182 * fVar182;
    auVar204._16_4_ = fVar217 * fVar217;
    auVar204._20_4_ = fVar223 * fVar223;
    auVar204._24_4_ = fVar240 * fVar240;
    auVar204._28_4_ = 0;
    auVar90 = vfmadd231ps_fma(auVar204,local_300,local_300);
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar90),local_2e0,local_2e0);
    auVar102 = vrcpps_avx(ZEXT1632(auVar88));
    auVar133._8_4_ = 0x3f800000;
    auVar133._0_8_ = 0x3f8000003f800000;
    auVar133._12_4_ = 0x3f800000;
    auVar133._16_4_ = 0x3f800000;
    auVar133._20_4_ = 0x3f800000;
    auVar133._24_4_ = 0x3f800000;
    auVar133._28_4_ = 0x3f800000;
    auVar90 = vfnmadd213ps_fma(auVar102,ZEXT1632(auVar88),auVar133);
    auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar102,auVar102);
    auVar17 = vpermps_avx2(_DAT_01fb7720,local_7e0);
    local_980 = vpermps_avx2(_DAT_01fb7720,auVar259);
    auVar10._4_4_ = fVar180 * auVar17._4_4_;
    auVar10._0_4_ = fVar179 * auVar17._0_4_;
    auVar10._8_4_ = fVar181 * auVar17._8_4_;
    auVar10._12_4_ = fVar182 * auVar17._12_4_;
    auVar10._16_4_ = fVar217 * auVar17._16_4_;
    auVar10._20_4_ = fVar223 * auVar17._20_4_;
    auVar10._24_4_ = fVar240 * auVar17._24_4_;
    auVar10._28_4_ = auVar102._28_4_;
    auVar121 = vfmsub231ps_fma(auVar10,local_980,local_2e0);
    local_9a0 = vpermps_avx2(_DAT_01fb7720,auVar254);
    auVar14._4_4_ = fVar267 * local_9a0._4_4_;
    auVar14._0_4_ = fVar241 * local_9a0._0_4_;
    auVar14._8_4_ = fVar268 * local_9a0._8_4_;
    auVar14._12_4_ = fVar270 * local_9a0._12_4_;
    auVar14._16_4_ = fVar271 * local_9a0._16_4_;
    auVar14._20_4_ = fVar272 * local_9a0._20_4_;
    auVar14._24_4_ = fVar273 * local_9a0._24_4_;
    auVar14._28_4_ = 0;
    auVar147 = vfmsub231ps_fma(auVar14,auVar17,local_300);
    auVar121 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar147._12_4_ * auVar147._12_4_,
                                                  CONCAT48(auVar147._8_4_ * auVar147._8_4_,
                                                           CONCAT44(auVar147._4_4_ * auVar147._4_4_,
                                                                    auVar147._0_4_ * auVar147._0_4_)
                                                          ))),ZEXT1632(auVar121),ZEXT1632(auVar121))
    ;
    auVar231._0_4_ = fVar224 * local_980._0_4_;
    auVar231._4_4_ = fVar225 * local_980._4_4_;
    auVar231._8_4_ = fVar226 * local_980._8_4_;
    auVar231._12_4_ = fVar227 * local_980._12_4_;
    auVar231._16_4_ = fVar228 * local_980._16_4_;
    auVar231._20_4_ = fVar233 * local_980._20_4_;
    auVar231._24_4_ = fVar239 * local_980._24_4_;
    auVar231._28_4_ = 0;
    auVar147 = vfmsub231ps_fma(auVar231,local_9a0,local_2c0);
    auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),ZEXT1632(auVar147),ZEXT1632(auVar147));
    auVar102 = vmaxps_avx(ZEXT1632(CONCAT412(auVar90._12_4_ * auVar89._12_4_,
                                             CONCAT48(auVar90._8_4_ * auVar89._8_4_,
                                                      CONCAT44(auVar90._4_4_ * auVar89._4_4_,
                                                               auVar90._0_4_ * auVar89._0_4_)))),
                          ZEXT1632(CONCAT412(auVar121._12_4_ * auVar90._12_4_,
                                             CONCAT48(auVar121._8_4_ * auVar90._8_4_,
                                                      CONCAT44(auVar121._4_4_ * auVar90._4_4_,
                                                               auVar121._0_4_ * auVar90._0_4_)))));
    auVar192._0_4_ = auVar120._0_4_ + fVar195;
    auVar192._4_4_ = auVar120._4_4_ + fVar211;
    auVar192._8_4_ = auVar120._8_4_ + fVar212;
    auVar192._12_4_ = auVar120._12_4_ + fVar213;
    auVar192._16_4_ = fVar183 * 0.0 + 0.0;
    auVar192._20_4_ = fVar183 * 0.0 + 0.0;
    auVar192._24_4_ = fVar183 * 0.0 + 0.0;
    auVar192._28_4_ = fVar183 + 0.0;
    auVar11 = vsubps_avx(auVar104,auVar206);
    auVar18 = vpermps_avx2(_DAT_01fb7720,auVar11);
    auVar19 = vpermps_avx2(_DAT_01fb7720,auVar104);
    auVar11 = vmaxps_avx(auVar104,auVar192);
    auVar12 = vmaxps_avx(auVar18,auVar19);
    auVar11 = vmaxps_avx(auVar11,auVar12);
    auVar12 = vrsqrtps_avx(ZEXT1632(auVar88));
    fVar195 = auVar12._0_4_;
    fVar211 = auVar12._4_4_;
    fVar212 = auVar12._8_4_;
    fVar213 = auVar12._12_4_;
    fVar214 = auVar12._16_4_;
    fVar215 = auVar12._20_4_;
    fVar216 = auVar12._24_4_;
    auVar21._4_4_ = fVar211 * fVar211 * fVar211 * auVar88._4_4_ * -0.5;
    auVar21._0_4_ = fVar195 * fVar195 * fVar195 * auVar88._0_4_ * -0.5;
    auVar21._8_4_ = fVar212 * fVar212 * fVar212 * auVar88._8_4_ * -0.5;
    auVar21._12_4_ = fVar213 * fVar213 * fVar213 * auVar88._12_4_ * -0.5;
    auVar21._16_4_ = fVar214 * fVar214 * fVar214 * -0.0;
    auVar21._20_4_ = fVar215 * fVar215 * fVar215 * -0.0;
    auVar21._24_4_ = fVar216 * fVar216 * fVar216 * -0.0;
    auVar21._28_4_ = local_980._28_4_;
    auVar205._8_4_ = 0x3fc00000;
    auVar205._0_8_ = 0x3fc000003fc00000;
    auVar205._12_4_ = 0x3fc00000;
    auVar205._16_4_ = 0x3fc00000;
    auVar205._20_4_ = 0x3fc00000;
    auVar205._24_4_ = 0x3fc00000;
    auVar205._28_4_ = 0x3fc00000;
    auVar90 = vfmadd231ps_fma(auVar21,auVar205,auVar12);
    fVar211 = auVar90._0_4_;
    fVar212 = auVar90._4_4_;
    auVar22._4_4_ = fVar225 * fVar212;
    auVar22._0_4_ = fVar224 * fVar211;
    fVar214 = auVar90._8_4_;
    auVar22._8_4_ = fVar226 * fVar214;
    fVar216 = auVar90._12_4_;
    auVar22._12_4_ = fVar227 * fVar216;
    auVar22._16_4_ = fVar228 * 0.0;
    auVar22._20_4_ = fVar233 * 0.0;
    uVar84 = auVar12._28_4_;
    auVar22._24_4_ = fVar239 * 0.0;
    auVar22._28_4_ = uVar84;
    auVar23._4_4_ = (float)local_8a0._4_4_ * fVar180 * fVar212;
    auVar23._0_4_ = (float)local_8a0._0_4_ * fVar179 * fVar211;
    auVar23._8_4_ = fStack_898 * fVar181 * fVar214;
    auVar23._12_4_ = fStack_894 * fVar182 * fVar216;
    auVar23._16_4_ = fStack_890 * fVar217 * 0.0;
    auVar23._20_4_ = fStack_88c * fVar223 * 0.0;
    auVar23._24_4_ = fStack_888 * fVar240 * 0.0;
    auVar23._28_4_ = local_2c0._28_4_;
    auVar90 = vfmadd231ps_fma(auVar23,auVar22,_local_6e0);
    local_2a0 = ZEXT1632(auVar156);
    auVar263 = vsubps_avx(ZEXT832(0) << 0x20,local_2a0);
    auVar238 = ZEXT3264(auVar263);
    fVar224 = auVar263._0_4_;
    fVar225 = auVar263._4_4_;
    auVar24._4_4_ = fVar225 * fVar180 * fVar212;
    auVar24._0_4_ = fVar224 * fVar179 * fVar211;
    fVar226 = auVar263._8_4_;
    auVar24._8_4_ = fVar226 * fVar181 * fVar214;
    fVar227 = auVar263._12_4_;
    auVar24._12_4_ = fVar227 * fVar182 * fVar216;
    fVar228 = auVar263._16_4_;
    auVar24._16_4_ = fVar228 * fVar217 * 0.0;
    fVar233 = auVar263._20_4_;
    auVar24._20_4_ = fVar233 * fVar223 * 0.0;
    fVar239 = auVar263._24_4_;
    auVar24._24_4_ = fVar239 * fVar240 * 0.0;
    auVar24._28_4_ = 0x3fc00000;
    auVar13 = vsubps_avx(ZEXT832(0) << 0x20,local_920);
    auVar232 = ZEXT3264(auVar13);
    auVar89 = vfmadd231ps_fma(auVar24,auVar13,auVar22);
    auVar25._4_4_ = fVar267 * fVar212;
    auVar25._0_4_ = fVar241 * fVar211;
    auVar25._8_4_ = fVar268 * fVar214;
    auVar25._12_4_ = fVar270 * fVar216;
    auVar25._16_4_ = fVar271 * 0.0;
    auVar25._20_4_ = fVar272 * 0.0;
    auVar25._24_4_ = fVar273 * 0.0;
    auVar25._28_4_ = uVar84;
    auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar25,_local_880);
    auVar266 = ZEXT1664(auVar90);
    auVar276 = ZEXT832(0) << 0x20;
    auVar208 = vsubps_avx(auVar276,auVar132);
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar208,auVar25);
    auVar12 = vsqrtps_avx(auVar102);
    auVar26._4_4_ = fVar225 * (float)local_8a0._4_4_;
    auVar26._0_4_ = fVar224 * (float)local_8a0._0_4_;
    auVar26._8_4_ = fVar226 * fStack_898;
    auVar26._12_4_ = fVar227 * fStack_894;
    auVar26._16_4_ = fVar228 * fStack_890;
    auVar26._20_4_ = fVar233 * fStack_88c;
    auVar26._24_4_ = fVar239 * fStack_888;
    auVar26._28_4_ = uVar84;
    auVar156 = vfmadd231ps_fma(auVar26,_local_6e0,auVar13);
    auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),_local_880,auVar208);
    fVar195 = auVar89._0_4_;
    fVar240 = auVar90._0_4_;
    fVar213 = auVar89._4_4_;
    fVar241 = auVar90._4_4_;
    fVar215 = auVar89._8_4_;
    fVar267 = auVar90._8_4_;
    fVar179 = auVar89._12_4_;
    fVar268 = auVar90._12_4_;
    uVar84 = local_6e0._28_4_;
    auVar27._28_4_ = uVar84;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(fVar268 * fVar179,
                            CONCAT48(fVar267 * fVar215,CONCAT44(fVar241 * fVar213,fVar240 * fVar195)
                                    )));
    auVar111 = vsubps_avx(ZEXT1632(auVar156),auVar27);
    auVar28._4_4_ = fVar225 * fVar225;
    auVar28._0_4_ = fVar224 * fVar224;
    auVar28._8_4_ = fVar226 * fVar226;
    auVar28._12_4_ = fVar227 * fVar227;
    auVar28._16_4_ = fVar228 * fVar228;
    auVar28._20_4_ = fVar233 * fVar233;
    auVar28._24_4_ = fVar239 * fVar239;
    auVar28._28_4_ = uVar84;
    auVar156 = vfmadd231ps_fma(auVar28,auVar13,auVar13);
    auVar156 = vfmadd231ps_fma(ZEXT1632(auVar156),auVar208,auVar208);
    auVar29._28_4_ = auVar102._28_4_;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(fVar179 * fVar179,
                            CONCAT48(fVar215 * fVar215,CONCAT44(fVar213 * fVar213,fVar195 * fVar195)
                                    )));
    auVar134 = vsubps_avx(ZEXT1632(auVar156),auVar29);
    fVar183 = auVar12._28_4_ + auVar11._28_4_;
    fVar195 = (auVar12._0_4_ + auVar11._0_4_) * 1.0000002;
    fVar213 = (auVar12._4_4_ + auVar11._4_4_) * 1.0000002;
    fVar215 = (auVar12._8_4_ + auVar11._8_4_) * 1.0000002;
    fVar179 = (auVar12._12_4_ + auVar11._12_4_) * 1.0000002;
    fVar180 = (auVar12._16_4_ + auVar11._16_4_) * 1.0000002;
    fVar181 = (auVar12._20_4_ + auVar11._20_4_) * 1.0000002;
    fVar182 = (auVar12._24_4_ + auVar11._24_4_) * 1.0000002;
    auVar30._4_4_ = fVar213 * fVar213;
    auVar30._0_4_ = fVar195 * fVar195;
    auVar30._8_4_ = fVar215 * fVar215;
    auVar30._12_4_ = fVar179 * fVar179;
    auVar30._16_4_ = fVar180 * fVar180;
    auVar30._20_4_ = fVar181 * fVar181;
    auVar30._24_4_ = fVar182 * fVar182;
    auVar30._28_4_ = fVar183;
    fVar217 = auVar111._0_4_ + auVar111._0_4_;
    fVar223 = auVar111._4_4_ + auVar111._4_4_;
    local_320._0_8_ = CONCAT44(fVar223,fVar217);
    local_320._8_4_ = auVar111._8_4_ + auVar111._8_4_;
    local_320._12_4_ = auVar111._12_4_ + auVar111._12_4_;
    local_320._16_4_ = auVar111._16_4_ + auVar111._16_4_;
    local_320._20_4_ = auVar111._20_4_ + auVar111._20_4_;
    local_320._24_4_ = auVar111._24_4_ + auVar111._24_4_;
    fVar195 = auVar111._28_4_;
    local_320._28_4_ = fVar195 + fVar195;
    auVar11 = vsubps_avx(auVar134,auVar30);
    auVar264 = ZEXT1632(auVar90);
    local_940._28_4_ = fVar183;
    local_940._0_28_ =
         ZEXT1628(CONCAT412(fVar268 * fVar268,
                            CONCAT48(fVar267 * fVar267,CONCAT44(fVar241 * fVar241,fVar240 * fVar240)
                                    )));
    local_3c0 = vsubps_avx(local_240,local_940);
    auVar31._4_4_ = fVar223 * fVar223;
    auVar31._0_4_ = fVar217 * fVar217;
    auVar31._8_4_ = local_320._8_4_ * local_320._8_4_;
    auVar31._12_4_ = local_320._12_4_ * local_320._12_4_;
    auVar31._16_4_ = local_320._16_4_ * local_320._16_4_;
    auVar31._20_4_ = local_320._20_4_ * local_320._20_4_;
    auVar31._24_4_ = local_320._24_4_ * local_320._24_4_;
    auVar31._28_4_ = fVar195;
    fVar195 = local_3c0._0_4_;
    local_280 = fVar195 * 4.0;
    fVar213 = local_3c0._4_4_;
    fStack_27c = fVar213 * 4.0;
    fVar215 = local_3c0._8_4_;
    fStack_278 = fVar215 * 4.0;
    fVar179 = local_3c0._12_4_;
    fStack_274 = fVar179 * 4.0;
    fVar180 = local_3c0._16_4_;
    fStack_270 = fVar180 * 4.0;
    fVar181 = local_3c0._20_4_;
    fStack_26c = fVar181 * 4.0;
    fVar182 = local_3c0._24_4_;
    fStack_268 = fVar182 * 4.0;
    uStack_264 = 0x40800000;
    auVar32._4_4_ = auVar11._4_4_ * fStack_27c;
    auVar32._0_4_ = auVar11._0_4_ * local_280;
    auVar32._8_4_ = auVar11._8_4_ * fStack_278;
    auVar32._12_4_ = auVar11._12_4_ * fStack_274;
    auVar32._16_4_ = auVar11._16_4_ * fStack_270;
    auVar32._20_4_ = auVar11._20_4_ * fStack_26c;
    auVar32._24_4_ = auVar11._24_4_ * fStack_268;
    auVar32._28_4_ = 0x40800000;
    auVar111 = vsubps_avx(auVar31,auVar32);
    auVar102 = vcmpps_avx(auVar111,auVar276,5);
    local_340._0_4_ = fVar195 + fVar195;
    local_340._4_4_ = fVar213 + fVar213;
    local_340._8_4_ = fVar215 + fVar215;
    local_340._12_4_ = fVar179 + fVar179;
    local_340._16_4_ = fVar180 + fVar180;
    local_340._20_4_ = fVar181 + fVar181;
    local_340._24_4_ = fVar182 + fVar182;
    local_340._28_4_ = local_3c0._28_4_ + local_3c0._28_4_;
    auVar206 = ZEXT1632(auVar89);
    if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar102 >> 0x7f,0) == '\0') &&
          (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar102 >> 0xbf,0) == '\0') &&
        (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar102[0x1f])
    {
      auVar220._8_4_ = 0x7f800000;
      auVar220._0_8_ = 0x7f8000007f800000;
      auVar220._12_4_ = 0x7f800000;
      auVar220._16_4_ = 0x7f800000;
      auVar220._20_4_ = 0x7f800000;
      auVar220._24_4_ = 0x7f800000;
      auVar220._28_4_ = 0x7f800000;
      auVar279 = ZEXT3264(CONCAT428(0xff800000,
                                    CONCAT424(0xff800000,
                                              CONCAT420(0xff800000,
                                                        CONCAT416(0xff800000,
                                                                  CONCAT412(0xff800000,
                                                                            CONCAT48(0xff800000,
                                                                                                                                                                          
                                                  0xff800000ff800000)))))));
    }
    else {
      auVar10 = vsqrtps_avx(auVar111);
      auVar276 = vcmpps_avx(auVar111,auVar276,5);
      auVar111 = vrcpps_avx(local_340);
      auVar105._8_4_ = 0x3f800000;
      auVar105._0_8_ = 0x3f8000003f800000;
      auVar105._12_4_ = 0x3f800000;
      auVar105._16_4_ = 0x3f800000;
      auVar105._20_4_ = 0x3f800000;
      auVar105._24_4_ = 0x3f800000;
      auVar105._28_4_ = 0x3f800000;
      auVar90 = vfnmadd213ps_fma(auVar111,local_340,auVar105);
      auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar111,auVar111);
      auVar280._0_8_ = CONCAT44(fVar223,fVar217) ^ 0x8000000080000000;
      auVar280._8_4_ = -local_320._8_4_;
      auVar280._12_4_ = -local_320._12_4_;
      auVar280._16_4_ = -local_320._16_4_;
      auVar280._20_4_ = -local_320._20_4_;
      auVar280._24_4_ = -local_320._24_4_;
      auVar280._28_4_ = -local_320._28_4_;
      auVar111 = vsubps_avx(auVar280,auVar10);
      auVar33._4_4_ = auVar111._4_4_ * auVar90._4_4_;
      auVar33._0_4_ = auVar111._0_4_ * auVar90._0_4_;
      auVar33._8_4_ = auVar111._8_4_ * auVar90._8_4_;
      auVar33._12_4_ = auVar111._12_4_ * auVar90._12_4_;
      auVar33._16_4_ = auVar111._16_4_ * 0.0;
      auVar33._20_4_ = auVar111._20_4_ * 0.0;
      auVar33._24_4_ = auVar111._24_4_ * 0.0;
      auVar33._28_4_ = auVar111._28_4_;
      auVar111 = vsubps_avx(auVar10,local_320);
      auVar277._0_4_ = auVar111._0_4_ * auVar90._0_4_;
      auVar277._4_4_ = auVar111._4_4_ * auVar90._4_4_;
      auVar277._8_4_ = auVar111._8_4_ * auVar90._8_4_;
      auVar277._12_4_ = auVar111._12_4_ * auVar90._12_4_;
      auVar277._16_4_ = auVar111._16_4_ * 0.0;
      auVar277._20_4_ = auVar111._20_4_ * 0.0;
      auVar277._24_4_ = auVar111._24_4_ * 0.0;
      auVar277._28_4_ = 0;
      auVar90 = vfmadd213ps_fma(auVar264,auVar33,auVar206);
      local_380 = fVar211 * auVar90._0_4_;
      fStack_37c = fVar212 * auVar90._4_4_;
      fStack_378 = fVar214 * auVar90._8_4_;
      fStack_374 = fVar216 * auVar90._12_4_;
      uStack_370 = 0;
      uStack_36c = 0;
      uStack_368 = 0;
      uStack_364 = 0x3f800000;
      auVar111 = vandps_avx(local_940,local_700);
      auVar111 = vmaxps_avx(local_620,auVar111);
      auVar34._4_4_ = auVar111._4_4_ * 1.9073486e-06;
      auVar34._0_4_ = auVar111._0_4_ * 1.9073486e-06;
      auVar34._8_4_ = auVar111._8_4_ * 1.9073486e-06;
      auVar34._12_4_ = auVar111._12_4_ * 1.9073486e-06;
      auVar34._16_4_ = auVar111._16_4_ * 1.9073486e-06;
      auVar34._20_4_ = auVar111._20_4_ * 1.9073486e-06;
      auVar34._24_4_ = auVar111._24_4_ * 1.9073486e-06;
      auVar34._28_4_ = auVar111._28_4_;
      auVar111 = vandps_avx(local_3c0,local_700);
      auVar10 = vcmpps_avx(auVar111,auVar34,1);
      auVar90 = vfmadd213ps_fma(auVar264,auVar277,auVar206);
      auVar106._8_4_ = 0x7f800000;
      auVar106._0_8_ = 0x7f8000007f800000;
      auVar106._12_4_ = 0x7f800000;
      auVar106._16_4_ = 0x7f800000;
      auVar106._20_4_ = 0x7f800000;
      auVar106._24_4_ = 0x7f800000;
      auVar106._28_4_ = 0x7f800000;
      auVar220 = vblendvps_avx(auVar106,auVar33,auVar276);
      local_3a0 = fVar211 * auVar90._0_4_;
      fStack_39c = fVar212 * auVar90._4_4_;
      fStack_398 = fVar214 * auVar90._8_4_;
      fStack_394 = fVar216 * auVar90._12_4_;
      uStack_390 = 0;
      uStack_38c = 0;
      uStack_388 = 0;
      uStack_384 = 0x7f800000;
      auVar173._8_4_ = 0xff800000;
      auVar173._0_8_ = 0xff800000ff800000;
      auVar173._12_4_ = 0xff800000;
      auVar173._16_4_ = 0xff800000;
      auVar173._20_4_ = 0xff800000;
      auVar173._24_4_ = 0xff800000;
      auVar173._28_4_ = 0xff800000;
      auVar111 = vblendvps_avx(auVar173,auVar277,auVar276);
      auVar279 = ZEXT3264(auVar111);
      auVar14 = auVar276 & auVar10;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') {
        auVar102 = vandps_avx(auVar10,auVar276);
        auVar10 = vcmpps_avx(auVar11,_DAT_01f7b000,2);
        auVar142._8_4_ = 0xff800000;
        auVar142._0_8_ = 0xff800000ff800000;
        auVar142._12_4_ = 0xff800000;
        auVar142._16_4_ = 0xff800000;
        auVar142._20_4_ = 0xff800000;
        auVar142._24_4_ = 0xff800000;
        auVar142._28_4_ = 0xff800000;
        auVar117._8_4_ = 0x7f800000;
        auVar117._0_8_ = 0x7f8000007f800000;
        auVar117._12_4_ = 0x7f800000;
        auVar117._16_4_ = 0x7f800000;
        auVar117._20_4_ = 0x7f800000;
        auVar117._24_4_ = 0x7f800000;
        auVar117._28_4_ = 0x7f800000;
        auVar11 = vblendvps_avx(auVar117,auVar142,auVar10);
        auVar90 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
        auVar14 = vpmovsxwd_avx2(auVar90);
        auVar220 = vblendvps_avx(auVar220,auVar11,auVar14);
        auVar11 = vblendvps_avx(auVar142,auVar117,auVar10);
        auVar11 = vblendvps_avx(auVar111,auVar11,auVar14);
        auVar279 = ZEXT3264(auVar11);
        auVar178._0_8_ = auVar102._0_8_ ^ 0xffffffffffffffff;
        auVar178._8_4_ = auVar102._8_4_ ^ 0xffffffff;
        auVar178._12_4_ = auVar102._12_4_ ^ 0xffffffff;
        auVar178._16_4_ = auVar102._16_4_ ^ 0xffffffff;
        auVar178._20_4_ = auVar102._20_4_ ^ 0xffffffff;
        auVar178._24_4_ = auVar102._24_4_ ^ 0xffffffff;
        auVar178._28_4_ = auVar102._28_4_ ^ 0xffffffff;
        auVar102 = vorps_avx(auVar10,auVar178);
        auVar102 = vandps_avx(auVar276,auVar102);
      }
    }
    auVar285 = ZEXT3264(_local_880);
    auVar11 = local_600 & auVar102;
    auVar250 = ZEXT3264(CONCAT428(0x3f800000,
                                  CONCAT424(0x3f800000,
                                            CONCAT420(0x3f800000,
                                                      CONCAT416(0x3f800000,
                                                                CONCAT412(0x3f800000,
                                                                          CONCAT48(0x3f800000,
                                                                                                                                                                      
                                                  0x3f8000003f800000)))))));
    auVar257 = ZEXT3264(_local_8c0);
    if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0x7f,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar11 >> 0xbf,0) != '\0') ||
        (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar11[0x1f] < '\0')
    {
      auVar250 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      fVar195 = *(float *)(ray + k * 4 + 0x80) - (float)local_900._0_4_;
      auVar174._4_4_ = fVar195;
      auVar174._0_4_ = fVar195;
      auVar174._8_4_ = fVar195;
      auVar174._12_4_ = fVar195;
      auVar174._16_4_ = fVar195;
      auVar174._20_4_ = fVar195;
      auVar174._24_4_ = fVar195;
      auVar174._28_4_ = fVar195;
      auVar111 = vminps_avx(auVar174,auVar279._0_32_);
      auVar35._4_4_ = fVar225 * auVar259._4_4_;
      auVar35._0_4_ = fVar224 * auVar259._0_4_;
      auVar35._8_4_ = fVar226 * auVar259._8_4_;
      auVar35._12_4_ = fVar227 * auVar259._12_4_;
      auVar35._16_4_ = fVar228 * auVar259._16_4_;
      auVar35._20_4_ = fVar233 * auVar259._20_4_;
      auVar35._24_4_ = fVar239 * auVar259._24_4_;
      auVar35._28_4_ = local_600._28_4_;
      auVar90 = vfmadd213ps_fma(auVar13,auVar254,auVar35);
      auVar71._4_4_ = fStack_35c;
      auVar71._0_4_ = local_360;
      auVar71._8_4_ = fStack_358;
      auVar71._12_4_ = fStack_354;
      auVar71._16_4_ = fStack_350;
      auVar71._20_4_ = fStack_34c;
      auVar71._24_4_ = fStack_348;
      auVar71._28_4_ = fStack_344;
      auVar13 = vmaxps_avx(auVar71,auVar220);
      auVar89 = vfmadd213ps_fma(auVar208,local_7e0,ZEXT1632(auVar90));
      auVar36._4_4_ = auVar259._4_4_ * (float)local_8a0._4_4_;
      auVar36._0_4_ = auVar259._0_4_ * (float)local_8a0._0_4_;
      auVar36._8_4_ = auVar259._8_4_ * fStack_898;
      auVar36._12_4_ = auVar259._12_4_ * fStack_894;
      auVar36._16_4_ = auVar259._16_4_ * fStack_890;
      auVar36._20_4_ = auVar259._20_4_ * fStack_88c;
      auVar36._24_4_ = auVar259._24_4_ * fStack_888;
      auVar36._28_4_ = auVar263._28_4_;
      auVar90 = vfmadd231ps_fma(auVar36,_local_6e0,auVar254);
      auVar156 = vfmadd231ps_fma(ZEXT1632(auVar90),_local_880,local_7e0);
      auVar11 = vandps_avx(ZEXT1632(auVar156),local_700);
      auVar107._8_4_ = 0x219392ef;
      auVar107._0_8_ = 0x219392ef219392ef;
      auVar107._12_4_ = 0x219392ef;
      auVar107._16_4_ = 0x219392ef;
      auVar107._20_4_ = 0x219392ef;
      auVar107._24_4_ = 0x219392ef;
      auVar107._28_4_ = 0x219392ef;
      auVar263 = vcmpps_avx(auVar11,auVar107,1);
      auVar11 = vrcpps_avx(ZEXT1632(auVar156));
      auVar108._8_4_ = 0x3f800000;
      auVar108._0_8_ = 0x3f8000003f800000;
      auVar108._12_4_ = 0x3f800000;
      auVar108._16_4_ = 0x3f800000;
      auVar108._20_4_ = 0x3f800000;
      auVar108._24_4_ = 0x3f800000;
      auVar108._28_4_ = 0x3f800000;
      auVar208 = ZEXT1632(auVar156);
      auVar90 = vfnmadd213ps_fma(auVar11,auVar208,auVar108);
      auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar11,auVar11);
      auVar281._0_8_ = auVar156._0_8_ ^ 0x8000000080000000;
      auVar281._8_4_ = auVar156._8_4_ ^ 0x80000000;
      auVar281._12_4_ = auVar156._12_4_ ^ 0x80000000;
      auVar281._16_4_ = 0x80000000;
      auVar281._20_4_ = 0x80000000;
      auVar281._24_4_ = 0x80000000;
      auVar281._28_4_ = 0x80000000;
      auVar37._4_4_ = auVar90._4_4_ * -auVar89._4_4_;
      auVar37._0_4_ = auVar90._0_4_ * -auVar89._0_4_;
      auVar37._8_4_ = auVar90._8_4_ * -auVar89._8_4_;
      auVar37._12_4_ = auVar90._12_4_ * -auVar89._12_4_;
      auVar37._16_4_ = 0x80000000;
      auVar37._20_4_ = 0x80000000;
      auVar37._24_4_ = 0x80000000;
      auVar37._28_4_ = 0x80000000;
      auVar11 = vcmpps_avx(auVar208,auVar281,1);
      auVar11 = vorps_avx(auVar263,auVar11);
      auVar278._8_4_ = 0xff800000;
      auVar278._0_8_ = 0xff800000ff800000;
      auVar278._12_4_ = 0xff800000;
      auVar278._16_4_ = 0xff800000;
      auVar278._20_4_ = 0xff800000;
      auVar278._24_4_ = 0xff800000;
      auVar278._28_4_ = 0xff800000;
      auVar11 = vblendvps_avx(auVar37,auVar278,auVar11);
      auVar13 = vmaxps_avx(auVar13,auVar11);
      auVar232 = ZEXT3264(auVar13);
      auVar11 = vcmpps_avx(auVar208,auVar281,6);
      auVar11 = vorps_avx(auVar263,auVar11);
      auVar282._8_4_ = 0x7f800000;
      auVar282._0_8_ = 0x7f8000007f800000;
      auVar282._12_4_ = 0x7f800000;
      auVar282._16_4_ = 0x7f800000;
      auVar282._20_4_ = 0x7f800000;
      auVar282._24_4_ = 0x7f800000;
      auVar282._28_4_ = 0x7f800000;
      auVar285 = ZEXT3264(auVar282);
      auVar11 = vblendvps_avx(auVar37,auVar282,auVar11);
      auVar208 = vminps_avx(auVar111,auVar11);
      fVar195 = -local_980._0_4_;
      fVar213 = -local_980._4_4_;
      fVar215 = -local_980._8_4_;
      fVar179 = -local_980._12_4_;
      fVar180 = -local_980._16_4_;
      fVar181 = -local_980._20_4_;
      fVar182 = -local_980._24_4_;
      auVar237._0_8_ = local_9a0._0_8_ ^ 0x8000000080000000;
      auVar237._8_4_ = -local_9a0._8_4_;
      auVar237._12_4_ = -local_9a0._12_4_;
      auVar237._16_4_ = -local_9a0._16_4_;
      auVar237._20_4_ = -local_9a0._20_4_;
      auVar237._24_4_ = -local_9a0._24_4_;
      auVar237._28_4_ = local_9a0._28_4_ ^ 0x80000000;
      auVar263 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar11 = vsubps_avx(auVar263,auVar16);
      auVar263 = vsubps_avx(auVar263,auVar15);
      auVar38._4_4_ = auVar263._4_4_ * fVar213;
      auVar38._0_4_ = auVar263._0_4_ * fVar195;
      auVar38._8_4_ = auVar263._8_4_ * fVar215;
      auVar38._12_4_ = auVar263._12_4_ * fVar179;
      auVar38._16_4_ = auVar263._16_4_ * fVar180;
      auVar38._20_4_ = auVar263._20_4_ * fVar181;
      auVar38._24_4_ = auVar263._24_4_ * fVar182;
      auVar38._28_4_ = auVar263._28_4_;
      auVar90 = vfmadd231ps_fma(auVar38,auVar237,auVar11);
      uStack_b64 = auVar17._28_4_;
      auVar247._0_8_ = auVar17._0_8_ ^ 0x8000000080000000;
      auVar247._8_4_ = -auVar17._8_4_;
      auVar247._12_4_ = -auVar17._12_4_;
      auVar247._16_4_ = -auVar17._16_4_;
      auVar247._20_4_ = -auVar17._20_4_;
      auVar247._24_4_ = -auVar17._24_4_;
      auVar247._28_4_ = uStack_b64 ^ 0x80000000;
      auVar11 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar207);
      auVar89 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar247,auVar11);
      auVar39._4_4_ = fVar213 * (float)local_8a0._4_4_;
      auVar39._0_4_ = fVar195 * (float)local_8a0._0_4_;
      auVar39._8_4_ = fVar215 * fStack_898;
      auVar39._12_4_ = fVar179 * fStack_894;
      auVar39._16_4_ = fVar180 * fStack_890;
      auVar39._20_4_ = fVar181 * fStack_88c;
      auVar39._24_4_ = fVar182 * fStack_888;
      auVar39._28_4_ = local_980._28_4_ ^ 0x80000000;
      auVar90 = vfmadd231ps_fma(auVar39,_local_6e0,auVar237);
      auVar156 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar247,_local_880);
      auVar11 = vandps_avx(ZEXT1632(auVar156),local_700);
      auVar111 = vrcpps_avx(ZEXT1632(auVar156));
      auVar109._8_4_ = 0x219392ef;
      auVar109._0_8_ = 0x219392ef219392ef;
      auVar109._12_4_ = 0x219392ef;
      auVar109._16_4_ = 0x219392ef;
      auVar109._20_4_ = 0x219392ef;
      auVar109._24_4_ = 0x219392ef;
      auVar109._28_4_ = 0x219392ef;
      auVar263 = vcmpps_avx(auVar11,auVar109,1);
      auVar207 = ZEXT1632(auVar156);
      auVar90 = vfnmadd213ps_fma(auVar111,auVar207,auVar108);
      auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar111,auVar111);
      auVar248._0_8_ = auVar156._0_8_ ^ 0x8000000080000000;
      auVar248._8_4_ = auVar156._8_4_ ^ 0x80000000;
      auVar248._12_4_ = auVar156._12_4_ ^ 0x80000000;
      auVar248._16_4_ = 0x80000000;
      auVar248._20_4_ = 0x80000000;
      auVar248._24_4_ = 0x80000000;
      auVar248._28_4_ = 0x80000000;
      auVar40._4_4_ = auVar90._4_4_ * -auVar89._4_4_;
      auVar40._0_4_ = auVar90._0_4_ * -auVar89._0_4_;
      auVar40._8_4_ = auVar90._8_4_ * -auVar89._8_4_;
      auVar40._12_4_ = auVar90._12_4_ * -auVar89._12_4_;
      auVar40._16_4_ = 0x80000000;
      auVar40._20_4_ = 0x80000000;
      auVar40._24_4_ = 0x80000000;
      auVar40._28_4_ = 0x80000000;
      auVar11 = vcmpps_avx(auVar207,auVar248,1);
      auVar11 = vorps_avx(auVar263,auVar11);
      auVar110._8_4_ = 0xff800000;
      auVar110._0_8_ = 0xff800000ff800000;
      auVar110._12_4_ = 0xff800000;
      auVar110._16_4_ = 0xff800000;
      auVar110._20_4_ = 0xff800000;
      auVar110._24_4_ = 0xff800000;
      auVar110._28_4_ = 0xff800000;
      auVar11 = vblendvps_avx(auVar40,auVar110,auVar11);
      auVar279 = ZEXT3264(auVar11);
      auVar13 = vmaxps_avx(auVar13,auVar11);
      auVar11 = vcmpps_avx(auVar207,auVar248,6);
      auVar11 = vorps_avx(auVar263,auVar11);
      auVar11 = vblendvps_avx(auVar40,auVar282,auVar11);
      auVar102 = vandps_avx(auVar102,local_600);
      auVar238 = ZEXT3264(auVar102);
      local_3e0 = vminps_avx(auVar208,auVar11);
      auVar11 = vcmpps_avx(auVar13,local_3e0,2);
      auVar263 = auVar102 & auVar11;
      if ((((((((auVar263 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar263 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar263 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar263 >> 0x7f,0) == '\0') &&
            (auVar263 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar263 >> 0xbf,0) == '\0') &&
          (auVar263 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar263[0x1f]) {
        auVar250 = ZEXT3264(auVar108);
        auVar257 = ZEXT3264(_local_8c0);
      }
      else {
        auVar70._4_4_ = fStack_37c;
        auVar70._0_4_ = local_380;
        auVar70._8_4_ = fStack_378;
        auVar70._12_4_ = fStack_374;
        auVar70._16_4_ = uStack_370;
        auVar70._20_4_ = uStack_36c;
        auVar70._24_4_ = uStack_368;
        auVar70._28_4_ = uStack_364;
        auVar263 = vminps_avx(auVar70,auVar108);
        auVar232 = ZEXT864(0) << 0x20;
        auVar263 = vmaxps_avx(auVar263,ZEXT832(0) << 0x20);
        auVar69._4_4_ = fStack_39c;
        auVar69._0_4_ = local_3a0;
        auVar69._8_4_ = fStack_398;
        auVar69._12_4_ = fStack_394;
        auVar69._16_4_ = uStack_390;
        auVar69._20_4_ = uStack_38c;
        auVar69._24_4_ = uStack_388;
        auVar69._28_4_ = uStack_384;
        auVar208 = vminps_avx(auVar69,auVar108);
        auVar208 = vmaxps_avx(auVar208,ZEXT832(0) << 0x20);
        auVar41._4_4_ = (auVar263._4_4_ + 1.0) * 0.125;
        auVar41._0_4_ = (auVar263._0_4_ + 0.0) * 0.125;
        auVar41._8_4_ = (auVar263._8_4_ + 2.0) * 0.125;
        auVar41._12_4_ = (auVar263._12_4_ + 3.0) * 0.125;
        auVar41._16_4_ = (auVar263._16_4_ + 4.0) * 0.125;
        auVar41._20_4_ = (auVar263._20_4_ + 5.0) * 0.125;
        auVar41._24_4_ = (auVar263._24_4_ + 6.0) * 0.125;
        auVar41._28_4_ = auVar263._28_4_ + 7.0;
        auVar90 = vfmadd213ps_fma(auVar41,auVar103,local_800);
        auVar42._4_4_ = (auVar208._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar208._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar208._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar208._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar208._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar208._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar208._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar208._28_4_ + 7.0;
        auVar89 = vfmadd213ps_fma(auVar42,auVar103,local_800);
        auVar263 = vminps_avx(auVar104,auVar192);
        auVar208 = vminps_avx(auVar18,auVar19);
        auVar263 = vminps_avx(auVar263,auVar208);
        auVar12 = vsubps_avx(auVar263,auVar12);
        auVar102 = vandps_avx(auVar102,auVar11);
        local_1a0 = ZEXT1632(auVar90);
        local_1c0 = ZEXT1632(auVar89);
        auVar43._4_4_ = auVar12._4_4_ * 0.99999976;
        auVar43._0_4_ = auVar12._0_4_ * 0.99999976;
        auVar43._8_4_ = auVar12._8_4_ * 0.99999976;
        auVar43._12_4_ = auVar12._12_4_ * 0.99999976;
        auVar43._16_4_ = auVar12._16_4_ * 0.99999976;
        auVar43._20_4_ = auVar12._20_4_ * 0.99999976;
        auVar43._24_4_ = auVar12._24_4_ * 0.99999976;
        auVar43._28_4_ = auVar12._28_4_;
        auVar11 = vmaxps_avx(ZEXT832(0) << 0x20,auVar43);
        auVar45._4_4_ = auVar11._4_4_ * auVar11._4_4_;
        auVar45._0_4_ = auVar11._0_4_ * auVar11._0_4_;
        auVar45._8_4_ = auVar11._8_4_ * auVar11._8_4_;
        auVar45._12_4_ = auVar11._12_4_ * auVar11._12_4_;
        auVar45._16_4_ = auVar11._16_4_ * auVar11._16_4_;
        auVar45._20_4_ = auVar11._20_4_ * auVar11._20_4_;
        uVar44 = auVar11._28_4_;
        auVar45._24_4_ = auVar11._24_4_ * auVar11._24_4_;
        auVar45._28_4_ = uVar44;
        auVar12 = vsubps_avx(auVar134,auVar45);
        auVar46._4_4_ = auVar12._4_4_ * fStack_27c;
        auVar46._0_4_ = auVar12._0_4_ * local_280;
        auVar46._8_4_ = auVar12._8_4_ * fStack_278;
        auVar46._12_4_ = auVar12._12_4_ * fStack_274;
        auVar46._16_4_ = auVar12._16_4_ * fStack_270;
        auVar46._20_4_ = auVar12._20_4_ * fStack_26c;
        auVar46._24_4_ = auVar12._24_4_ * fStack_268;
        auVar46._28_4_ = uVar44;
        auVar263 = vsubps_avx(auVar31,auVar46);
        auVar11 = vcmpps_avx(auVar263,ZEXT832(0) << 0x20,5);
        auVar285 = ZEXT3264(auVar11);
        if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar11 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar11 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar11 >> 0x7f,0) == '\0') &&
              (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar11 >> 0xbf,0) == '\0') &&
            (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar11[0x1f]) {
          auVar207 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar246 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar111 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar134 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar257 = ZEXT864(0) << 0x20;
          auVar260._8_4_ = 0x7f800000;
          auVar260._0_8_ = 0x7f8000007f800000;
          auVar260._12_4_ = 0x7f800000;
          auVar260._16_4_ = 0x7f800000;
          auVar260._20_4_ = 0x7f800000;
          auVar260._24_4_ = 0x7f800000;
          auVar260._28_4_ = 0x7f800000;
          auVar265._8_4_ = 0xff800000;
          auVar265._0_8_ = 0xff800000ff800000;
          auVar265._12_4_ = 0xff800000;
          auVar265._16_4_ = 0xff800000;
          auVar265._20_4_ = 0xff800000;
          auVar265._24_4_ = 0xff800000;
          auVar265._28_4_ = 0xff800000;
        }
        else {
          auVar111 = vrcpps_avx(local_340);
          auVar112._8_4_ = 0x3f800000;
          auVar112._0_8_ = 0x3f8000003f800000;
          auVar112._12_4_ = 0x3f800000;
          auVar112._16_4_ = 0x3f800000;
          auVar112._20_4_ = 0x3f800000;
          auVar112._24_4_ = 0x3f800000;
          auVar112._28_4_ = 0x3f800000;
          auVar90 = vfnmadd213ps_fma(local_340,auVar111,auVar112);
          auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar111,auVar111);
          auVar111 = vsqrtps_avx(auVar263);
          auVar249._0_8_ = local_320._0_8_ ^ 0x8000000080000000;
          auVar249._8_4_ = -local_320._8_4_;
          auVar249._12_4_ = -local_320._12_4_;
          auVar249._16_4_ = -local_320._16_4_;
          auVar249._20_4_ = -local_320._20_4_;
          auVar249._24_4_ = -local_320._24_4_;
          auVar249._28_4_ = -local_320._28_4_;
          auVar134 = vsubps_avx(auVar249,auVar111);
          auVar111 = vsubps_avx(auVar111,local_320);
          fVar195 = auVar134._0_4_ * auVar90._0_4_;
          fVar213 = auVar134._4_4_ * auVar90._4_4_;
          auVar47._4_4_ = fVar213;
          auVar47._0_4_ = fVar195;
          fVar215 = auVar134._8_4_ * auVar90._8_4_;
          auVar47._8_4_ = fVar215;
          fVar179 = auVar134._12_4_ * auVar90._12_4_;
          auVar47._12_4_ = fVar179;
          fVar180 = auVar134._16_4_ * 0.0;
          auVar47._16_4_ = fVar180;
          fVar181 = auVar134._20_4_ * 0.0;
          auVar47._20_4_ = fVar181;
          fVar182 = auVar134._24_4_ * 0.0;
          auVar47._24_4_ = fVar182;
          auVar47._28_4_ = uVar44;
          fVar183 = auVar111._0_4_ * auVar90._0_4_;
          fVar217 = auVar111._4_4_ * auVar90._4_4_;
          auVar48._4_4_ = fVar217;
          auVar48._0_4_ = fVar183;
          fVar223 = auVar111._8_4_ * auVar90._8_4_;
          auVar48._8_4_ = fVar223;
          fVar224 = auVar111._12_4_ * auVar90._12_4_;
          auVar48._12_4_ = fVar224;
          fVar225 = auVar111._16_4_ * 0.0;
          auVar48._16_4_ = fVar225;
          fVar226 = auVar111._20_4_ * 0.0;
          auVar48._20_4_ = fVar226;
          fVar227 = auVar111._24_4_ * 0.0;
          auVar48._24_4_ = fVar227;
          auVar48._28_4_ = auVar208._28_4_;
          auVar90 = vfmadd213ps_fma(auVar264,auVar47,auVar206);
          auVar89 = vfmadd213ps_fma(auVar264,auVar48,auVar206);
          auVar208 = ZEXT1632(CONCAT412(fVar216 * auVar90._12_4_,
                                        CONCAT48(fVar214 * auVar90._8_4_,
                                                 CONCAT44(fVar212 * auVar90._4_4_,
                                                          fVar211 * auVar90._0_4_))));
          auVar111 = ZEXT1632(CONCAT412(fVar216 * auVar89._12_4_,
                                        CONCAT48(fVar214 * auVar89._8_4_,
                                                 CONCAT44(fVar212 * auVar89._4_4_,
                                                          fVar211 * auVar89._0_4_))));
          auVar90 = vfmadd213ps_fma(local_2e0,auVar208,auVar132);
          auVar89 = vfmadd213ps_fma(local_2e0,auVar111,auVar132);
          auVar156 = vfmadd213ps_fma(local_300,auVar208,local_920);
          auVar120 = vfmadd213ps_fma(local_300,auVar111,local_920);
          auVar88 = vfmadd213ps_fma(auVar208,local_2c0,local_2a0);
          auVar121 = vfmadd213ps_fma(local_2c0,auVar111,local_2a0);
          auVar49._4_4_ = (float)local_880._4_4_ * fVar213;
          auVar49._0_4_ = (float)local_880._0_4_ * fVar195;
          auVar49._8_4_ = fStack_878 * fVar215;
          auVar49._12_4_ = fStack_874 * fVar179;
          auVar49._16_4_ = fStack_870 * fVar180;
          auVar49._20_4_ = fStack_86c * fVar181;
          auVar49._24_4_ = fStack_868 * fVar182;
          auVar49._28_4_ = 0;
          auVar111 = vsubps_avx(auVar49,ZEXT1632(auVar90));
          auVar50._4_4_ = (float)local_6e0._4_4_ * fVar213;
          auVar50._0_4_ = (float)local_6e0._0_4_ * fVar195;
          auVar50._8_4_ = fStack_6d8 * fVar215;
          auVar50._12_4_ = fStack_6d4 * fVar179;
          auVar50._16_4_ = fStack_6d0 * fVar180;
          auVar50._20_4_ = fStack_6cc * fVar181;
          auVar50._24_4_ = fStack_6c8 * fVar182;
          auVar50._28_4_ = 0x80000000;
          auVar134 = vsubps_avx(auVar50,ZEXT1632(auVar156));
          auVar162._0_4_ = (float)local_8a0._0_4_ * fVar195;
          auVar162._4_4_ = (float)local_8a0._4_4_ * fVar213;
          auVar162._8_4_ = fStack_898 * fVar215;
          auVar162._12_4_ = fStack_894 * fVar179;
          auVar162._16_4_ = fStack_890 * fVar180;
          auVar162._20_4_ = fStack_88c * fVar181;
          auVar162._24_4_ = fStack_888 * fVar182;
          auVar162._28_4_ = 0;
          auVar208 = vsubps_avx(auVar162,ZEXT1632(auVar88));
          auVar257 = ZEXT3264(auVar208);
          auVar209._0_4_ = fVar183 * (float)local_880._0_4_;
          auVar209._4_4_ = fVar217 * (float)local_880._4_4_;
          auVar209._8_4_ = fVar223 * fStack_878;
          auVar209._12_4_ = fVar224 * fStack_874;
          auVar209._16_4_ = fVar225 * fStack_870;
          auVar209._20_4_ = fVar226 * fStack_86c;
          auVar209._24_4_ = fVar227 * fStack_868;
          auVar209._28_4_ = 0;
          auVar208 = vsubps_avx(auVar209,ZEXT1632(auVar89));
          auVar232 = ZEXT3264(auVar208);
          auVar51._4_4_ = (float)local_6e0._4_4_ * fVar217;
          auVar51._0_4_ = (float)local_6e0._0_4_ * fVar183;
          auVar51._8_4_ = fStack_6d8 * fVar223;
          auVar51._12_4_ = fStack_6d4 * fVar224;
          auVar51._16_4_ = fStack_6d0 * fVar225;
          auVar51._20_4_ = fStack_6cc * fVar226;
          auVar51._24_4_ = fStack_6c8 * fVar227;
          auVar51._28_4_ = 0;
          auVar207 = vsubps_avx(auVar51,ZEXT1632(auVar120));
          auVar52._4_4_ = (float)local_8a0._4_4_ * fVar217;
          auVar52._0_4_ = (float)local_8a0._0_4_ * fVar183;
          auVar52._8_4_ = fStack_898 * fVar223;
          auVar52._12_4_ = fStack_894 * fVar224;
          auVar52._16_4_ = fStack_890 * fVar225;
          auVar52._20_4_ = fStack_88c * fVar226;
          auVar52._24_4_ = fStack_888 * fVar227;
          auVar52._28_4_ = uVar84;
          auVar208 = vsubps_avx(auVar52,ZEXT1632(auVar121));
          auVar246 = auVar208._0_28_;
          auVar208 = vcmpps_avx(auVar263,_DAT_01f7b000,5);
          auVar261._8_4_ = 0x7f800000;
          auVar261._0_8_ = 0x7f8000007f800000;
          auVar261._12_4_ = 0x7f800000;
          auVar261._16_4_ = 0x7f800000;
          auVar261._20_4_ = 0x7f800000;
          auVar261._24_4_ = 0x7f800000;
          auVar261._28_4_ = 0x7f800000;
          auVar260 = vblendvps_avx(auVar261,auVar47,auVar208);
          auVar263 = vandps_avx(local_700,local_940);
          auVar263 = vmaxps_avx(local_620,auVar263);
          auVar53._4_4_ = auVar263._4_4_ * 1.9073486e-06;
          auVar53._0_4_ = auVar263._0_4_ * 1.9073486e-06;
          auVar53._8_4_ = auVar263._8_4_ * 1.9073486e-06;
          auVar53._12_4_ = auVar263._12_4_ * 1.9073486e-06;
          auVar53._16_4_ = auVar263._16_4_ * 1.9073486e-06;
          auVar53._20_4_ = auVar263._20_4_ * 1.9073486e-06;
          auVar53._24_4_ = auVar263._24_4_ * 1.9073486e-06;
          auVar53._28_4_ = auVar263._28_4_;
          auVar263 = vandps_avx(local_700,local_3c0);
          auVar263 = vcmpps_avx(auVar263,auVar53,1);
          auVar221._8_4_ = 0xff800000;
          auVar221._0_8_ = 0xff800000ff800000;
          auVar221._12_4_ = 0xff800000;
          auVar221._16_4_ = 0xff800000;
          auVar221._20_4_ = 0xff800000;
          auVar221._24_4_ = 0xff800000;
          auVar221._28_4_ = 0xff800000;
          auVar265 = vblendvps_avx(auVar221,auVar48,auVar208);
          auVar15 = auVar208 & auVar263;
          if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar15 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar15 >> 0x7f,0) == '\0') &&
                (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar15 >> 0xbf,0) == '\0') &&
              (auVar15 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar15[0x1f]) {
            auVar285 = ZEXT3264(auVar11);
          }
          else {
            auVar11 = vandps_avx(auVar263,auVar208);
            auVar263 = vcmpps_avx(auVar12,_DAT_01f7b000,2);
            auVar194._8_4_ = 0x7f800000;
            auVar194._0_8_ = 0x7f8000007f800000;
            auVar194._12_4_ = 0x7f800000;
            auVar194._16_4_ = 0x7f800000;
            auVar194._20_4_ = 0x7f800000;
            auVar194._24_4_ = 0x7f800000;
            auVar194._28_4_ = 0x7f800000;
            auVar283._8_4_ = 0xff800000;
            auVar283._0_8_ = 0xff800000ff800000;
            auVar283._12_4_ = 0xff800000;
            auVar283._16_4_ = 0xff800000;
            auVar283._20_4_ = 0xff800000;
            auVar283._24_4_ = 0xff800000;
            auVar283._28_4_ = 0xff800000;
            auVar12 = vblendvps_avx(auVar194,auVar283,auVar263);
            auVar90 = vpackssdw_avx(auVar11._0_16_,auVar11._16_16_);
            auVar15 = vpmovsxwd_avx2(auVar90);
            auVar260 = vblendvps_avx(auVar260,auVar12,auVar15);
            auVar284._8_4_ = 0xff800000;
            auVar284._0_8_ = 0xff800000ff800000;
            auVar284._12_4_ = 0xff800000;
            auVar284._16_4_ = 0xff800000;
            auVar284._20_4_ = 0xff800000;
            auVar284._24_4_ = 0xff800000;
            auVar284._28_4_ = 0xff800000;
            auVar12 = vblendvps_avx(auVar284,auVar194,auVar263);
            auVar265 = vblendvps_avx(auVar265,auVar12,auVar15);
            auVar222._0_8_ = auVar11._0_8_ ^ 0xffffffffffffffff;
            auVar222._8_4_ = auVar11._8_4_ ^ 0xffffffff;
            auVar222._12_4_ = auVar11._12_4_ ^ 0xffffffff;
            auVar222._16_4_ = auVar11._16_4_ ^ 0xffffffff;
            auVar222._20_4_ = auVar11._20_4_ ^ 0xffffffff;
            auVar222._24_4_ = auVar11._24_4_ ^ 0xffffffff;
            auVar222._28_4_ = auVar11._28_4_ ^ 0xffffffff;
            auVar11 = vorps_avx(auVar263,auVar222);
            auVar11 = vandps_avx(auVar208,auVar11);
            auVar285 = ZEXT3264(auVar11);
          }
        }
        local_440 = auVar13;
        local_420 = vminps_avx(local_3e0,auVar260);
        auVar12 = vmaxps_avx(auVar13,auVar265);
        auVar279 = ZEXT3264(auVar12);
        _local_400 = auVar12;
        auVar11 = vcmpps_avx(auVar13,local_420,2);
        auVar238 = ZEXT3264(auVar11);
        local_660 = vandps_avx(auVar11,auVar102);
        auVar266 = ZEXT3264(local_660);
        auVar11 = vcmpps_avx(auVar12,local_3e0,2);
        _local_9c0 = vandps_avx(auVar11,auVar102);
        auVar102 = vorps_avx(local_660,_local_9c0);
        if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar102 >> 0x7f,0) == '\0') &&
              (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar102 >> 0xbf,0) == '\0') &&
            (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar102[0x1f]) {
          auVar250 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          auVar257 = ZEXT3264(_local_8c0);
        }
        else {
          auVar54._4_4_ = (float)local_8a0._4_4_ * auVar246._4_4_;
          auVar54._0_4_ = (float)local_8a0._0_4_ * auVar246._0_4_;
          auVar54._8_4_ = fStack_898 * auVar246._8_4_;
          auVar54._12_4_ = fStack_894 * auVar246._12_4_;
          auVar54._16_4_ = fStack_890 * auVar246._16_4_;
          auVar54._20_4_ = fStack_88c * auVar246._20_4_;
          auVar54._24_4_ = fStack_888 * auVar246._24_4_;
          auVar54._28_4_ = auVar102._28_4_;
          auVar90 = vfmadd213ps_fma(auVar207,_local_6e0,auVar54);
          auVar238 = ZEXT3264(_local_6e0);
          auVar90 = vfmadd213ps_fma(auVar232._0_32_,_local_880,ZEXT1632(auVar90));
          auVar175._0_8_ = auVar285._0_8_ ^ 0xffffffffffffffff;
          auVar175._8_4_ = auVar285._8_4_ ^ 0xffffffff;
          auVar175._12_4_ = auVar285._12_4_ ^ 0xffffffff;
          auVar175._16_4_ = auVar285._16_4_ ^ 0xffffffff;
          auVar175._20_4_ = auVar285._20_4_ ^ 0xffffffff;
          auVar175._24_4_ = auVar285._24_4_ ^ 0xffffffff;
          auVar175._28_4_ = auVar285._28_4_ ^ 0xffffffff;
          auVar102 = vandps_avx(local_700,ZEXT1632(auVar90));
          auVar210._8_4_ = 0x3e99999a;
          auVar210._0_8_ = 0x3e99999a3e99999a;
          auVar210._12_4_ = 0x3e99999a;
          auVar210._16_4_ = 0x3e99999a;
          auVar210._20_4_ = 0x3e99999a;
          auVar210._24_4_ = 0x3e99999a;
          auVar210._28_4_ = 0x3e99999a;
          auVar102 = vcmpps_avx(auVar102,auVar210,1);
          local_6a0 = vorps_avx(auVar102,auVar175);
          auVar279._0_4_ = (float)local_8a0._0_4_ * auVar257._0_4_;
          auVar279._4_4_ = (float)local_8a0._4_4_ * auVar257._4_4_;
          auVar279._8_4_ = fStack_898 * auVar257._8_4_;
          auVar279._12_4_ = fStack_894 * auVar257._12_4_;
          auVar279._16_4_ = fStack_890 * auVar257._16_4_;
          auVar279._20_4_ = fStack_88c * auVar257._20_4_;
          auVar279._28_36_ = auVar257._28_36_;
          auVar279._24_4_ = fStack_888 * auVar257._24_4_;
          auVar90 = vfmadd213ps_fma(auVar134,_local_6e0,auVar279._0_32_);
          auVar232 = ZEXT3264(_local_9c0);
          auVar90 = vfmadd213ps_fma(auVar111,_local_880,ZEXT1632(auVar90));
          auVar102 = vandps_avx(local_700,ZEXT1632(auVar90));
          auVar102 = vcmpps_avx(auVar102,auVar210,1);
          auVar102 = vorps_avx(auVar102,auVar175);
          auVar135._8_4_ = 3;
          auVar135._0_8_ = 0x300000003;
          auVar135._12_4_ = 3;
          auVar135._16_4_ = 3;
          auVar135._20_4_ = 3;
          auVar135._24_4_ = 3;
          auVar135._28_4_ = 3;
          auVar163._8_4_ = 2;
          auVar163._0_8_ = 0x200000002;
          auVar163._12_4_ = 2;
          auVar163._16_4_ = 2;
          auVar163._20_4_ = 2;
          auVar163._24_4_ = 2;
          auVar163._28_4_ = 2;
          auVar102 = vblendvps_avx(auVar163,auVar135,auVar102);
          local_6c0._4_4_ = local_c04;
          local_6c0._0_4_ = local_c04;
          local_6c0._8_4_ = local_c04;
          local_6c0._12_4_ = local_c04;
          local_6c0._16_4_ = local_c04;
          local_6c0._20_4_ = local_c04;
          local_6c0._24_4_ = local_c04;
          local_6c0._28_4_ = local_c04;
          local_680 = vpcmpgtd_avx2(auVar102,local_6c0);
          local_460 = vpandn_avx2(local_680,local_660);
          local_820._4_4_ = auVar13._4_4_ + (float)local_8c0._4_4_;
          local_820._0_4_ = auVar13._0_4_ + (float)local_8c0._0_4_;
          fStack_818 = auVar13._8_4_ + fStack_8b8;
          fStack_814 = auVar13._12_4_ + fStack_8b4;
          fStack_810 = auVar13._16_4_ + fStack_8b0;
          fStack_80c = auVar13._20_4_ + fStack_8ac;
          fStack_808 = auVar13._24_4_ + fStack_8a8;
          fStack_804 = auVar13._28_4_ + fStack_8a4;
          while( true ) {
            auVar102 = _local_400;
            auVar279 = ZEXT3264(auVar12);
            fStack_a9c = auVar6._4_4_;
            fStack_a98 = auVar6._8_4_;
            fStack_a94 = auVar6._12_4_;
            if ((((((((local_460 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_460 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_460 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_460 >> 0x7f,0) == '\0') &&
                  (local_460 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_460 >> 0xbf,0) == '\0') &&
                (local_460 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_460[0x1f]) break;
            auVar136._8_4_ = 0x7f800000;
            auVar136._0_8_ = 0x7f8000007f800000;
            auVar136._12_4_ = 0x7f800000;
            auVar136._16_4_ = 0x7f800000;
            auVar136._20_4_ = 0x7f800000;
            auVar136._24_4_ = 0x7f800000;
            auVar136._28_4_ = 0x7f800000;
            auVar102 = vblendvps_avx(auVar136,auVar13,local_460);
            auVar11 = vshufps_avx(auVar102,auVar102,0xb1);
            auVar11 = vminps_avx(auVar102,auVar11);
            auVar263 = vshufpd_avx(auVar11,auVar11,5);
            auVar11 = vminps_avx(auVar11,auVar263);
            auVar263 = vpermpd_avx2(auVar11,0x4e);
            auVar11 = vminps_avx(auVar11,auVar263);
            auVar11 = vcmpps_avx(auVar102,auVar11,0);
            auVar263 = local_460 & auVar11;
            auVar102 = local_460;
            if ((((((((auVar263 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar263 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar263 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar263 >> 0x7f,0) != '\0') ||
                  (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar263 >> 0xbf,0) != '\0') ||
                (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar263[0x1f] < '\0') {
              auVar102 = vandps_avx(auVar11,local_460);
            }
            uVar76 = vmovmskps_avx(auVar102);
            iVar20 = 0;
            for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            uVar79 = (ulong)(uint)(iVar20 << 2);
            *(undefined4 *)(local_460 + uVar79) = 0;
            uVar76 = *(uint *)(local_1a0 + uVar79);
            uVar81 = *(uint *)(local_440 + uVar79);
            fVar195 = auVar4._0_4_;
            if ((float)local_960._0_4_ < 0.0) {
              auVar238 = ZEXT1664(auVar238._0_16_);
              auVar266 = ZEXT1664(auVar266._0_16_);
              auVar285 = ZEXT1664(auVar285._0_16_);
              fVar195 = sqrtf((float)local_960._0_4_);
              uVar79 = extraout_RAX;
            }
            auVar89 = vminps_avx(auVar7,auVar9);
            auVar90 = vmaxps_avx(auVar7,auVar9);
            auVar156 = vminps_avx(auVar8,auVar6);
            auVar120 = vminps_avx(auVar89,auVar156);
            auVar89 = vmaxps_avx(auVar8,auVar6);
            auVar156 = vmaxps_avx(auVar90,auVar89);
            auVar90 = vandps_avx(auVar120,auVar234);
            auVar89 = vandps_avx(auVar156,auVar234);
            auVar90 = vmaxps_avx(auVar90,auVar89);
            auVar89 = vmovshdup_avx(auVar90);
            auVar89 = vmaxss_avx(auVar89,auVar90);
            auVar90 = vshufpd_avx(auVar90,auVar90,1);
            auVar90 = vmaxss_avx(auVar90,auVar89);
            local_920._0_4_ = auVar90._0_4_ * 1.9073486e-06;
            local_7e0._0_4_ = fVar195 * 1.9073486e-06;
            local_800._0_16_ = vshufps_avx(auVar156,auVar156,0xff);
            auVar90 = vinsertps_avx(ZEXT416(uVar81),ZEXT416(uVar76),0x10);
            for (uVar83 = 0; bVar86 = (byte)uVar79, uVar83 != 5; uVar83 = uVar83 + 1) {
              fVar215 = auVar90._0_4_;
              auVar91._4_4_ = fVar215;
              auVar91._0_4_ = fVar215;
              auVar91._8_4_ = fVar215;
              auVar91._12_4_ = fVar215;
              auVar120 = vfmadd213ps_fma(auVar91,local_950,_DAT_01f45a50);
              auVar156 = vmovshdup_avx(auVar90);
              fVar216 = auVar156._0_4_;
              fVar214 = 1.0 - fVar216;
              auVar92 = SUB6416(ZEXT464(0x40400000),0);
              auVar147 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar88 = vfmadd213ss_fma(auVar92,auVar156,auVar147);
              auVar89 = vfmadd213ss_fma(auVar88,ZEXT416((uint)(fVar216 * fVar216)),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar121 = vfmadd213ss_fma(auVar92,ZEXT416((uint)fVar214),auVar147);
              auVar121 = vfmadd213ss_fma(auVar121,ZEXT416((uint)(fVar214 * fVar214)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar195 = fVar214 * fVar214 * -fVar216 * 0.5;
              fVar211 = auVar89._0_4_ * 0.5;
              fVar212 = auVar121._0_4_ * 0.5;
              fVar213 = fVar216 * fVar216 * -fVar214 * 0.5;
              auVar165._0_4_ = fVar213 * fVar118;
              auVar165._4_4_ = fVar213 * fStack_a9c;
              auVar165._8_4_ = fVar213 * fStack_a98;
              auVar165._12_4_ = fVar213 * fStack_a94;
              auVar186._4_4_ = fVar212;
              auVar186._0_4_ = fVar212;
              auVar186._8_4_ = fVar212;
              auVar186._12_4_ = fVar212;
              auVar89 = vfmadd132ps_fma(auVar186,auVar165,auVar8);
              auVar143._4_4_ = fVar211;
              auVar143._0_4_ = fVar211;
              auVar143._8_4_ = fVar211;
              auVar143._12_4_ = fVar211;
              auVar89 = vfmadd132ps_fma(auVar143,auVar89,auVar9);
              auVar166._4_4_ = fVar195;
              auVar166._0_4_ = fVar195;
              auVar166._8_4_ = fVar195;
              auVar166._12_4_ = fVar195;
              local_860 = vfmadd132ps_fma(auVar166,auVar89,auVar7);
              auVar185 = vfmadd231ss_fma(auVar147,auVar156,ZEXT416(0x41100000));
              auVar121 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar156,ZEXT416(0x40800000)
                                        );
              auVar120 = vsubps_avx(auVar120,local_860);
              auVar89 = vdpps_avx(auVar120,auVar120,0x7f);
              auVar147 = vfmadd213ss_fma(auVar92,auVar156,ZEXT416(0xbf800000));
              fVar195 = auVar89._0_4_;
              if (fVar195 < 0.0) {
                local_980._0_16_ = auVar185;
                local_9a0._0_4_ = fVar214 * -2.0;
                auVar238._0_4_ = sqrtf(fVar195);
                auVar238._4_60_ = extraout_var;
                auVar88 = ZEXT416(auVar88._0_4_);
                auVar92 = auVar238._0_16_;
                uVar79 = extraout_RAX_00;
                fVar211 = (float)local_9a0._0_4_;
                auVar185 = local_980._0_16_;
              }
              else {
                auVar92 = vsqrtss_avx(auVar89,auVar89);
                fVar211 = fVar214 * -2.0;
              }
              auVar285 = ZEXT1664(auVar185);
              auVar119 = vfmadd213ss_fma(auVar88,ZEXT416((uint)(fVar216 + fVar216)),
                                         ZEXT416((uint)(fVar216 * fVar216 * 3.0)));
              auVar197 = SUB6416(ZEXT464(0x40000000),0);
              auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar156,auVar197);
              auVar184 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * fVar214 * -3.0)),
                                         ZEXT416((uint)(fVar214 + fVar214)),auVar88);
              auVar196 = vfnmadd231ss_fma(ZEXT416((uint)(fVar216 * (fVar214 + fVar214))),
                                          ZEXT416((uint)fVar214),ZEXT416((uint)fVar214));
              auVar88 = vfmadd213ss_fma(ZEXT416((uint)fVar211),auVar156,
                                        ZEXT416((uint)(fVar216 * fVar216)));
              fVar211 = auVar184._0_4_ * 0.5;
              fVar212 = auVar88._0_4_ * 0.5;
              auVar144._0_4_ = fVar118 * fVar212;
              auVar144._4_4_ = fStack_a9c * fVar212;
              auVar144._8_4_ = fStack_a98 * fVar212;
              auVar144._12_4_ = fStack_a94 * fVar212;
              auVar122._4_4_ = fVar211;
              auVar122._0_4_ = fVar211;
              auVar122._8_4_ = fVar211;
              auVar122._12_4_ = fVar211;
              auVar88 = vfmadd213ps_fma(auVar122,auVar8,auVar144);
              fVar211 = auVar196._0_4_ * 0.5;
              fVar212 = auVar119._0_4_ * 0.5;
              auVar145._4_4_ = fVar212;
              auVar145._0_4_ = fVar212;
              auVar145._8_4_ = fVar212;
              auVar145._12_4_ = fVar212;
              auVar88 = vfmadd213ps_fma(auVar145,auVar9,auVar88);
              auVar252._4_4_ = fVar211;
              auVar252._0_4_ = fVar211;
              auVar252._8_4_ = fVar211;
              auVar252._12_4_ = fVar211;
              auVar119 = vfmadd213ps_fma(auVar252,auVar7,auVar88);
              auVar184 = vfmadd213ss_fma(auVar156,SUB6416(ZEXT464(0xc0400000),0),auVar197);
              local_b20 = auVar147._0_4_;
              auVar93._0_4_ = fVar118 * local_b20;
              auVar93._4_4_ = fStack_a9c * local_b20;
              auVar93._8_4_ = fStack_a98 * local_b20;
              auVar93._12_4_ = fStack_a94 * local_b20;
              local_a20 = auVar121._0_4_;
              auVar123._4_4_ = local_a20;
              auVar123._0_4_ = local_a20;
              auVar123._8_4_ = local_a20;
              auVar123._12_4_ = local_a20;
              auVar156 = vfmadd213ps_fma(auVar123,auVar8,auVar93);
              uVar84 = auVar185._0_4_;
              auVar146._4_4_ = uVar84;
              auVar146._0_4_ = uVar84;
              auVar146._8_4_ = uVar84;
              auVar146._12_4_ = uVar84;
              auVar156 = vfmadd213ps_fma(auVar146,auVar9,auVar156);
              auVar88 = vdpps_avx(auVar119,auVar119,0x7f);
              uVar84 = auVar184._0_4_;
              auVar124._4_4_ = uVar84;
              auVar124._0_4_ = uVar84;
              auVar124._8_4_ = uVar84;
              auVar124._12_4_ = uVar84;
              auVar147 = vfmadd213ps_fma(auVar124,auVar7,auVar156);
              auVar156 = vblendps_avx(auVar88,_DAT_01f45a50,0xe);
              auVar121 = vrsqrtss_avx(auVar156,auVar156);
              fVar213 = auVar88._0_4_;
              fVar211 = auVar121._0_4_;
              auVar121 = vdpps_avx(auVar119,auVar147,0x7f);
              fVar211 = fVar211 * 1.5 + fVar213 * -0.5 * fVar211 * fVar211 * fVar211;
              auVar125._0_4_ = auVar147._0_4_ * fVar213;
              auVar125._4_4_ = auVar147._4_4_ * fVar213;
              auVar125._8_4_ = auVar147._8_4_ * fVar213;
              auVar125._12_4_ = auVar147._12_4_ * fVar213;
              fVar212 = auVar121._0_4_;
              auVar200._0_4_ = auVar119._0_4_ * fVar212;
              auVar200._4_4_ = auVar119._4_4_ * fVar212;
              fVar214 = auVar119._8_4_;
              auVar200._8_4_ = fVar214 * fVar212;
              fVar216 = auVar119._12_4_;
              auVar200._12_4_ = fVar216 * fVar212;
              auVar121 = vsubps_avx(auVar125,auVar200);
              auVar156 = vrcpss_avx(auVar156,auVar156);
              auVar147 = vfnmadd213ss_fma(auVar156,auVar88,auVar197);
              fVar212 = auVar156._0_4_ * auVar147._0_4_;
              auVar156 = vmaxss_avx(ZEXT416((uint)local_920._0_4_),
                                    ZEXT416((uint)(fVar215 * (float)local_7e0._0_4_)));
              auVar250 = ZEXT1664(auVar156);
              auVar235._0_8_ = auVar119._0_8_ ^ 0x8000000080000000;
              auVar235._8_4_ = -fVar214;
              auVar235._12_4_ = -fVar216;
              auVar167._0_4_ = fVar211 * auVar121._0_4_ * fVar212;
              auVar167._4_4_ = fVar211 * auVar121._4_4_ * fVar212;
              auVar167._8_4_ = fVar211 * auVar121._8_4_ * fVar212;
              auVar167._12_4_ = fVar211 * auVar121._12_4_ * fVar212;
              auVar244._0_4_ = auVar119._0_4_ * fVar211;
              auVar244._4_4_ = auVar119._4_4_ * fVar211;
              auVar244._8_4_ = fVar214 * fVar211;
              auVar244._12_4_ = fVar216 * fVar211;
              if (fVar213 < -fVar213) {
                auVar285 = ZEXT1664(auVar185);
                fVar211 = sqrtf(fVar213);
                auVar250 = ZEXT464(auVar156._0_4_);
                auVar92 = ZEXT416(auVar92._0_4_);
                uVar79 = extraout_RAX_01;
              }
              else {
                auVar88 = vsqrtss_avx(auVar88,auVar88);
                fVar211 = auVar88._0_4_;
              }
              auVar88 = vdpps_avx(auVar120,auVar244,0x7f);
              auVar184 = vfmadd213ss_fma(ZEXT416((uint)local_920._0_4_),auVar92,auVar250._0_16_);
              auVar121 = vdpps_avx(auVar235,auVar244,0x7f);
              auVar147 = vdpps_avx(auVar120,auVar167,0x7f);
              auVar185 = vdpps_avx(local_950,auVar244,0x7f);
              auVar184 = vfmadd213ss_fma(ZEXT416((uint)(auVar92._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_920._0_4_ / fVar211)),auVar184)
              ;
              fVar211 = auVar121._0_4_ + auVar147._0_4_;
              auVar266 = ZEXT464((uint)fVar211);
              fVar213 = auVar88._0_4_;
              auVar94._0_4_ = fVar213 * fVar213;
              auVar94._4_4_ = auVar88._4_4_ * auVar88._4_4_;
              auVar94._8_4_ = auVar88._8_4_ * auVar88._8_4_;
              auVar94._12_4_ = auVar88._12_4_ * auVar88._12_4_;
              auVar121 = vdpps_avx(auVar120,auVar235,0x7f);
              auVar92 = vsubps_avx(auVar89,auVar94);
              auVar147 = vrsqrtss_avx(auVar92,auVar92);
              fVar214 = auVar92._0_4_;
              fVar212 = auVar147._0_4_;
              fVar212 = fVar212 * 1.5 + fVar214 * -0.5 * fVar212 * fVar212 * fVar212;
              auVar147 = vdpps_avx(auVar120,local_950,0x7f);
              auVar121 = vfnmadd231ss_fma(auVar121,auVar88,ZEXT416((uint)fVar211));
              auVar147 = vfnmadd231ss_fma(auVar147,auVar88,auVar185);
              if (fVar214 < 0.0) {
                local_980._0_16_ = auVar121;
                local_9a0._0_4_ = fVar212;
                local_940._0_16_ = auVar147;
                auVar285 = ZEXT1664(auVar285._0_16_);
                fVar214 = sqrtf(fVar214);
                auVar266 = ZEXT1664(ZEXT416((uint)fVar211));
                auVar250 = ZEXT464(auVar156._0_4_);
                uVar79 = extraout_RAX_02;
                fVar212 = (float)local_9a0._0_4_;
                auVar147 = local_940._0_16_;
                auVar121 = local_980._0_16_;
              }
              else {
                auVar156 = vsqrtss_avx(auVar92,auVar92);
                fVar214 = auVar156._0_4_;
              }
              auVar238 = ZEXT1664(auVar119);
              auVar156 = vpermilps_avx(local_860,0xff);
              fVar214 = fVar214 - auVar156._0_4_;
              auVar92 = vshufps_avx(auVar119,auVar119,0xff);
              auVar156 = vfmsub213ss_fma(auVar121,ZEXT416((uint)fVar212),auVar92);
              auVar168._0_8_ = auVar185._0_8_ ^ 0x8000000080000000;
              auVar168._8_4_ = auVar185._8_4_ ^ 0x80000000;
              auVar168._12_4_ = auVar185._12_4_ ^ 0x80000000;
              auVar187._0_8_ = auVar156._0_8_ ^ 0x8000000080000000;
              auVar187._8_4_ = auVar156._8_4_ ^ 0x80000000;
              auVar187._12_4_ = auVar156._12_4_ ^ 0x80000000;
              auVar147 = ZEXT416((uint)(auVar147._0_4_ * fVar212));
              auVar196 = auVar266._0_16_;
              auVar121 = vfmsub231ss_fma(ZEXT416((uint)(auVar185._0_4_ * auVar156._0_4_)),auVar196,
                                         auVar147);
              auVar156 = vinsertps_avx(auVar187,auVar147,0x1c);
              uVar84 = auVar121._0_4_;
              auVar188._4_4_ = uVar84;
              auVar188._0_4_ = uVar84;
              auVar188._8_4_ = uVar84;
              auVar188._12_4_ = uVar84;
              auVar156 = vdivps_avx(auVar156,auVar188);
              auVar121 = vinsertps_avx(auVar196,auVar168,0x10);
              auVar121 = vdivps_avx(auVar121,auVar188);
              auVar148._0_4_ = fVar213 * auVar156._0_4_ + fVar214 * auVar121._0_4_;
              auVar148._4_4_ = fVar213 * auVar156._4_4_ + fVar214 * auVar121._4_4_;
              auVar148._8_4_ = fVar213 * auVar156._8_4_ + fVar214 * auVar121._8_4_;
              auVar148._12_4_ = fVar213 * auVar156._12_4_ + fVar214 * auVar121._12_4_;
              auVar90 = vsubps_avx(auVar90,auVar148);
              auVar156 = vandps_avx(auVar88,auVar234);
              if (auVar156._0_4_ < auVar184._0_4_) {
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar184._0_4_ + auVar250._0_4_)),
                                          local_800._0_16_,ZEXT416(0x36000000));
                auVar156 = vandps_avx(ZEXT416((uint)fVar214),auVar234);
                if (auVar156._0_4_ < auVar88._0_4_) {
                  bVar85 = uVar83 < 5;
                  fVar211 = auVar90._0_4_ + (float)local_900._0_4_;
                  if (fVar211 < fVar87) {
                    bVar86 = 0;
                    goto LAB_0116c292;
                  }
                  fVar212 = *(float *)(ray + k * 4 + 0x80);
                  auVar232 = ZEXT3264(_local_9c0);
                  if (fVar211 <= fVar212) {
                    auVar156 = vmovshdup_avx(auVar90);
                    bVar86 = 0;
                    if ((auVar156._0_4_ < 0.0) || (1.0 < auVar156._0_4_)) goto LAB_0116c2ad;
                    auVar89 = vrsqrtss_avx(auVar89,auVar89);
                    fVar213 = auVar89._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar77].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (bVar86 = 1, pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar195 = fVar213 * 1.5 + fVar195 * -0.5 * fVar213 * fVar213 * fVar213;
                        local_ae0 = auVar120._0_4_;
                        fStack_adc = auVar120._4_4_;
                        fStack_ad8 = auVar120._8_4_;
                        fStack_ad4 = auVar120._12_4_;
                        auVar149._0_4_ = fVar195 * local_ae0;
                        auVar149._4_4_ = fVar195 * fStack_adc;
                        auVar149._8_4_ = fVar195 * fStack_ad8;
                        auVar149._12_4_ = fVar195 * fStack_ad4;
                        auVar88 = vfmadd213ps_fma(auVar92,auVar149,auVar119);
                        auVar89 = vshufps_avx(auVar149,auVar149,0xc9);
                        auVar156 = vshufps_avx(auVar119,auVar119,0xc9);
                        auVar150._0_4_ = auVar149._0_4_ * auVar156._0_4_;
                        auVar150._4_4_ = auVar149._4_4_ * auVar156._4_4_;
                        auVar150._8_4_ = auVar149._8_4_ * auVar156._8_4_;
                        auVar150._12_4_ = auVar149._12_4_ * auVar156._12_4_;
                        auVar120 = vfmsub231ps_fma(auVar150,auVar119,auVar89);
                        auVar89 = vshufps_avx(auVar120,auVar120,0xc9);
                        auVar156 = vshufps_avx(auVar88,auVar88,0xc9);
                        auVar120 = vshufps_avx(auVar120,auVar120,0xd2);
                        auVar95._0_4_ = auVar88._0_4_ * auVar120._0_4_;
                        auVar95._4_4_ = auVar88._4_4_ * auVar120._4_4_;
                        auVar95._8_4_ = auVar88._8_4_ * auVar120._8_4_;
                        auVar95._12_4_ = auVar88._12_4_ * auVar120._12_4_;
                        auVar89 = vfmsub231ps_fma(auVar95,auVar89,auVar156);
                        local_770 = vshufps_avx(auVar90,auVar90,0x55);
                        local_7a0 = (RTCHitN  [16])vshufps_avx(auVar89,auVar89,0x55);
                        auStack_790 = vshufps_avx(auVar89,auVar89,0xaa);
                        local_780 = auVar89._0_4_;
                        local_760 = ZEXT416(0) << 0x20;
                        local_750 = CONCAT44(uStack_7bc,local_7c0);
                        uStack_748 = CONCAT44(uStack_7b4,uStack_7b8);
                        local_740._4_4_ = uStack_7ac;
                        local_740._0_4_ = local_7b0;
                        local_740._8_4_ = uStack_7a8;
                        local_740._12_4_ = uStack_7a4;
                        vpcmpeqd_avx2(ZEXT1632(local_740),ZEXT1632(local_740));
                        uStack_72c = context->user->instID[0];
                        local_730 = uStack_72c;
                        uStack_728 = uStack_72c;
                        uStack_724 = uStack_72c;
                        uStack_720 = context->user->instPrimID[0];
                        uStack_71c = uStack_720;
                        uStack_718 = uStack_720;
                        uStack_714 = uStack_720;
                        *(float *)(ray + k * 4 + 0x80) = fVar211;
                        auVar90 = *(undefined1 (*) [16])
                                   (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                        local_840._0_16_ = auVar90;
                        local_9f0.valid = (int *)local_840;
                        local_9f0.geometryUserPtr = pGVar2->userPtr;
                        local_9f0.context = context->user;
                        local_9f0.hit = local_7a0;
                        local_9f0.N = 4;
                        local_9f0.ray = (RTCRayN *)ray;
                        uStack_77c = local_780;
                        uStack_778 = local_780;
                        uStack_774 = local_780;
                        if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar238 = ZEXT1664(auVar119);
                          auVar266 = ZEXT1664(auVar196);
                          auVar285 = ZEXT1664(auVar285._0_16_);
                          (*pGVar2->occlusionFilterN)(&local_9f0);
                          auVar232 = ZEXT3264(_local_9c0);
                          auVar90 = local_840._0_16_;
                        }
                        if (auVar90 == (undefined1  [16])0x0) {
                          auVar90 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                          auVar90 = auVar90 ^ _DAT_01f46b70;
                        }
                        else {
                          p_Var3 = context->args->filter;
                          if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar238 = ZEXT1664(auVar238._0_16_);
                            auVar266 = ZEXT1664(auVar266._0_16_);
                            auVar285 = ZEXT1664(auVar285._0_16_);
                            (*p_Var3)(&local_9f0);
                            auVar232 = ZEXT3264(_local_9c0);
                            auVar90 = local_840._0_16_;
                          }
                          auVar89 = vpcmpeqd_avx(auVar90,_DAT_01f45a50);
                          auVar90 = auVar89 ^ _DAT_01f46b70;
                          auVar151._8_4_ = 0xff800000;
                          auVar151._0_8_ = 0xff800000ff800000;
                          auVar151._12_4_ = 0xff800000;
                          auVar89 = vblendvps_avx(auVar151,*(undefined1 (*) [16])
                                                            (local_9f0.ray + 0x80),auVar89);
                          *(undefined1 (*) [16])(local_9f0.ray + 0x80) = auVar89;
                        }
                        auVar126._8_8_ = 0x100000001;
                        auVar126._0_8_ = 0x100000001;
                        bVar86 = (auVar126 & auVar90) != (undefined1  [16])0x0;
                        if (!(bool)bVar86) {
                          *(float *)(ray + k * 4 + 0x80) = fVar212;
                        }
                      }
                      goto LAB_0116c2ad;
                    }
                  }
                  bVar86 = 0;
                  goto LAB_0116c2ad;
                }
              }
            }
            bVar85 = false;
LAB_0116c292:
            auVar232 = ZEXT3264(_local_9c0);
LAB_0116c2ad:
            uVar84 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar255._4_4_ = uVar84;
            auVar255._0_4_ = uVar84;
            auVar255._8_4_ = uVar84;
            auVar255._12_4_ = uVar84;
            auVar255._16_4_ = uVar84;
            auVar255._20_4_ = uVar84;
            auVar255._24_4_ = uVar84;
            auVar255._28_4_ = uVar84;
            auVar250 = ZEXT3264(auVar255);
            bVar82 = bVar82 | bVar85 & bVar86;
            auVar102 = vcmpps_avx(_local_820,auVar255,2);
            local_460 = vandps_avx(auVar102,local_460);
          }
          auVar113._0_4_ = auVar12._0_4_ + (float)local_8c0._0_4_;
          auVar113._4_4_ = auVar12._4_4_ + (float)local_8c0._4_4_;
          auVar113._8_4_ = auVar12._8_4_ + fStack_8b8;
          auVar113._12_4_ = auVar12._12_4_ + fStack_8b4;
          auVar113._16_4_ = auVar12._16_4_ + fStack_8b0;
          auVar113._20_4_ = auVar12._20_4_ + fStack_8ac;
          auVar113._24_4_ = auVar12._24_4_ + fStack_8a8;
          auVar113._28_4_ = auVar12._28_4_ + fStack_8a4;
          uVar84 = auVar250._0_4_;
          auVar137._4_4_ = uVar84;
          auVar137._0_4_ = uVar84;
          auVar137._8_4_ = uVar84;
          auVar137._12_4_ = uVar84;
          auVar137._16_4_ = uVar84;
          auVar137._20_4_ = uVar84;
          auVar137._24_4_ = uVar84;
          auVar137._28_4_ = uVar84;
          auVar11 = vcmpps_avx(auVar113,auVar137,2);
          _local_820 = vandps_avx(auVar11,auVar232._0_32_);
          auVar114._8_4_ = 3;
          auVar114._0_8_ = 0x300000003;
          auVar114._12_4_ = 3;
          auVar114._16_4_ = 3;
          auVar114._20_4_ = 3;
          auVar114._24_4_ = 3;
          auVar114._28_4_ = 3;
          auVar138._8_4_ = 2;
          auVar138._0_8_ = 0x200000002;
          auVar138._12_4_ = 2;
          auVar138._16_4_ = 2;
          auVar138._20_4_ = 2;
          auVar138._24_4_ = 2;
          auVar138._28_4_ = 2;
          auVar11 = vblendvps_avx(auVar138,auVar114,local_6a0);
          auVar11 = vpcmpgtd_avx2(auVar11,local_6c0);
          local_840 = vpandn_avx2(auVar11,_local_820);
          local_9c0._4_4_ = (float)local_8c0._4_4_ + (float)local_400._4_4_;
          local_9c0._0_4_ = (float)local_8c0._0_4_ + (float)local_400._0_4_;
          fStack_9b8 = fStack_8b8 + fStack_3f8;
          fStack_9b4 = fStack_8b4 + fStack_3f4;
          fStack_9b0 = fStack_8b0 + fStack_3f0;
          fStack_9ac = fStack_8ac + fStack_3ec;
          fStack_9a8 = fStack_8a8 + fStack_3e8;
          fStack_9a4 = fStack_8a4 + fStack_3e4;
          for (; (((((((local_840 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_840 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_840 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_840 >> 0x7f,0) != '\0') ||
                   (local_840 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_840 >> 0xbf,0) != '\0') ||
                 (local_840 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_840[0x1f] < '\0'; local_840 = vandps_avx(auVar12,local_840)) {
            auVar139._8_4_ = 0x7f800000;
            auVar139._0_8_ = 0x7f8000007f800000;
            auVar139._12_4_ = 0x7f800000;
            auVar139._16_4_ = 0x7f800000;
            auVar139._20_4_ = 0x7f800000;
            auVar139._24_4_ = 0x7f800000;
            auVar139._28_4_ = 0x7f800000;
            auVar12 = vblendvps_avx(auVar139,auVar102,local_840);
            auVar263 = vshufps_avx(auVar12,auVar12,0xb1);
            auVar263 = vminps_avx(auVar12,auVar263);
            auVar13 = vshufpd_avx(auVar263,auVar263,5);
            auVar263 = vminps_avx(auVar263,auVar13);
            auVar13 = vpermpd_avx2(auVar263,0x4e);
            auVar263 = vminps_avx(auVar263,auVar13);
            auVar263 = vcmpps_avx(auVar12,auVar263,0);
            auVar13 = local_840 & auVar263;
            auVar12 = local_840;
            if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0x7f,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0xbf,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar13[0x1f] < '\0') {
              auVar12 = vandps_avx(auVar263,local_840);
            }
            uVar76 = vmovmskps_avx(auVar12);
            iVar20 = 0;
            for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            uVar79 = (ulong)(uint)(iVar20 << 2);
            *(undefined4 *)(local_840 + uVar79) = 0;
            uVar76 = *(uint *)(local_1c0 + uVar79);
            uVar81 = *(uint *)(local_3e0 + uVar79);
            fVar195 = auVar5._0_4_;
            if ((float)local_960._0_4_ < 0.0) {
              auVar238 = ZEXT1664(auVar238._0_16_);
              auVar266 = ZEXT1664(auVar266._0_16_);
              auVar279 = ZEXT1664(auVar279._0_16_);
              auVar285 = ZEXT1664(auVar285._0_16_);
              fVar195 = sqrtf((float)local_960._0_4_);
              uVar79 = extraout_RAX_03;
            }
            auVar232 = ZEXT464(uVar81);
            auVar89 = vminps_avx(auVar7,auVar9);
            auVar90 = vmaxps_avx(auVar7,auVar9);
            auVar156 = vminps_avx(auVar8,auVar6);
            auVar120 = vminps_avx(auVar89,auVar156);
            auVar89 = vmaxps_avx(auVar8,auVar6);
            auVar156 = vmaxps_avx(auVar90,auVar89);
            auVar90 = vandps_avx(auVar120,auVar234);
            auVar89 = vandps_avx(auVar156,auVar234);
            auVar90 = vmaxps_avx(auVar90,auVar89);
            auVar89 = vmovshdup_avx(auVar90);
            auVar89 = vmaxss_avx(auVar89,auVar90);
            auVar90 = vshufpd_avx(auVar90,auVar90,1);
            auVar90 = vmaxss_avx(auVar90,auVar89);
            local_920._0_4_ = auVar90._0_4_ * 1.9073486e-06;
            local_7e0._0_4_ = fVar195 * 1.9073486e-06;
            local_800._0_16_ = vshufps_avx(auVar156,auVar156,0xff);
            auVar90 = vinsertps_avx(ZEXT416(uVar81),ZEXT416(uVar76),0x10);
            for (uVar83 = 0; bVar86 = (byte)uVar79, uVar83 != 5; uVar83 = uVar83 + 1) {
              fVar215 = auVar90._0_4_;
              auVar96._4_4_ = fVar215;
              auVar96._0_4_ = fVar215;
              auVar96._8_4_ = fVar215;
              auVar96._12_4_ = fVar215;
              auVar120 = vfmadd213ps_fma(auVar96,local_950,_DAT_01f45a50);
              auVar156 = vmovshdup_avx(auVar90);
              fVar216 = auVar156._0_4_;
              fVar214 = 1.0 - fVar216;
              auVar92 = SUB6416(ZEXT464(0x40400000),0);
              auVar147 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar88 = vfmadd213ss_fma(auVar92,auVar156,auVar147);
              auVar89 = vfmadd213ss_fma(auVar88,ZEXT416((uint)(fVar216 * fVar216)),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar121 = vfmadd213ss_fma(auVar92,ZEXT416((uint)fVar214),auVar147);
              auVar121 = vfmadd213ss_fma(auVar121,ZEXT416((uint)(fVar214 * fVar214)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar195 = fVar214 * fVar214 * -fVar216 * 0.5;
              fVar211 = auVar89._0_4_ * 0.5;
              fVar212 = auVar121._0_4_ * 0.5;
              fVar213 = fVar216 * fVar216 * -fVar214 * 0.5;
              auVar169._0_4_ = fVar213 * fVar118;
              auVar169._4_4_ = fVar213 * fStack_a9c;
              auVar169._8_4_ = fVar213 * fStack_a98;
              auVar169._12_4_ = fVar213 * fStack_a94;
              auVar189._4_4_ = fVar212;
              auVar189._0_4_ = fVar212;
              auVar189._8_4_ = fVar212;
              auVar189._12_4_ = fVar212;
              auVar89 = vfmadd132ps_fma(auVar189,auVar169,auVar8);
              auVar152._4_4_ = fVar211;
              auVar152._0_4_ = fVar211;
              auVar152._8_4_ = fVar211;
              auVar152._12_4_ = fVar211;
              auVar89 = vfmadd132ps_fma(auVar152,auVar89,auVar9);
              auVar170._4_4_ = fVar195;
              auVar170._0_4_ = fVar195;
              auVar170._8_4_ = fVar195;
              auVar170._12_4_ = fVar195;
              local_860 = vfmadd132ps_fma(auVar170,auVar89,auVar7);
              auVar185 = vfmadd231ss_fma(auVar147,auVar156,ZEXT416(0x41100000));
              auVar121 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar156,ZEXT416(0x40800000)
                                        );
              auVar120 = vsubps_avx(auVar120,local_860);
              auVar89 = vdpps_avx(auVar120,auVar120,0x7f);
              auVar147 = vfmadd213ss_fma(auVar92,auVar156,ZEXT416(0xbf800000));
              fVar195 = auVar89._0_4_;
              if (fVar195 < 0.0) {
                local_980._0_16_ = auVar185;
                local_9a0._0_4_ = fVar214 * -2.0;
                auVar232._0_4_ = sqrtf(fVar195);
                auVar232._4_60_ = extraout_var_00;
                auVar88 = ZEXT416(auVar88._0_4_);
                auVar92 = auVar232._0_16_;
                uVar79 = extraout_RAX_04;
                fVar211 = (float)local_9a0._0_4_;
                auVar185 = local_980._0_16_;
              }
              else {
                auVar92 = vsqrtss_avx(auVar89,auVar89);
                fVar211 = fVar214 * -2.0;
              }
              auVar285 = ZEXT1664(auVar185);
              auVar119 = vfmadd213ss_fma(auVar88,ZEXT416((uint)(fVar216 + fVar216)),
                                         ZEXT416((uint)(fVar216 * fVar216 * 3.0)));
              auVar197 = SUB6416(ZEXT464(0x40000000),0);
              auVar88 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar156,auVar197);
              auVar184 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * fVar214 * -3.0)),
                                         ZEXT416((uint)(fVar214 + fVar214)),auVar88);
              auVar196 = vfnmadd231ss_fma(ZEXT416((uint)(fVar216 * (fVar214 + fVar214))),
                                          ZEXT416((uint)fVar214),ZEXT416((uint)fVar214));
              auVar88 = vfmadd213ss_fma(ZEXT416((uint)fVar211),auVar156,
                                        ZEXT416((uint)(fVar216 * fVar216)));
              fVar211 = auVar184._0_4_ * 0.5;
              fVar212 = auVar88._0_4_ * 0.5;
              auVar153._0_4_ = fVar118 * fVar212;
              auVar153._4_4_ = fStack_a9c * fVar212;
              auVar153._8_4_ = fStack_a98 * fVar212;
              auVar153._12_4_ = fStack_a94 * fVar212;
              auVar127._4_4_ = fVar211;
              auVar127._0_4_ = fVar211;
              auVar127._8_4_ = fVar211;
              auVar127._12_4_ = fVar211;
              auVar88 = vfmadd213ps_fma(auVar127,auVar8,auVar153);
              fVar211 = auVar196._0_4_ * 0.5;
              fVar212 = auVar119._0_4_ * 0.5;
              auVar154._4_4_ = fVar212;
              auVar154._0_4_ = fVar212;
              auVar154._8_4_ = fVar212;
              auVar154._12_4_ = fVar212;
              auVar88 = vfmadd213ps_fma(auVar154,auVar9,auVar88);
              auVar253._4_4_ = fVar211;
              auVar253._0_4_ = fVar211;
              auVar253._8_4_ = fVar211;
              auVar253._12_4_ = fVar211;
              auVar119 = vfmadd213ps_fma(auVar253,auVar7,auVar88);
              auVar184 = vfmadd213ss_fma(auVar156,SUB6416(ZEXT464(0xc0400000),0),auVar197);
              local_b20 = auVar147._0_4_;
              auVar97._0_4_ = fVar118 * local_b20;
              auVar97._4_4_ = fStack_a9c * local_b20;
              auVar97._8_4_ = fStack_a98 * local_b20;
              auVar97._12_4_ = fStack_a94 * local_b20;
              local_a20 = auVar121._0_4_;
              auVar128._4_4_ = local_a20;
              auVar128._0_4_ = local_a20;
              auVar128._8_4_ = local_a20;
              auVar128._12_4_ = local_a20;
              auVar156 = vfmadd213ps_fma(auVar128,auVar8,auVar97);
              uVar84 = auVar185._0_4_;
              auVar155._4_4_ = uVar84;
              auVar155._0_4_ = uVar84;
              auVar155._8_4_ = uVar84;
              auVar155._12_4_ = uVar84;
              auVar156 = vfmadd213ps_fma(auVar155,auVar9,auVar156);
              auVar88 = vdpps_avx(auVar119,auVar119,0x7f);
              uVar84 = auVar184._0_4_;
              auVar129._4_4_ = uVar84;
              auVar129._0_4_ = uVar84;
              auVar129._8_4_ = uVar84;
              auVar129._12_4_ = uVar84;
              auVar147 = vfmadd213ps_fma(auVar129,auVar7,auVar156);
              auVar156 = vblendps_avx(auVar88,_DAT_01f45a50,0xe);
              auVar121 = vrsqrtss_avx(auVar156,auVar156);
              fVar213 = auVar88._0_4_;
              fVar211 = auVar121._0_4_;
              auVar121 = vdpps_avx(auVar119,auVar147,0x7f);
              fVar211 = fVar211 * 1.5 + fVar213 * -0.5 * fVar211 * fVar211 * fVar211;
              auVar130._0_4_ = auVar147._0_4_ * fVar213;
              auVar130._4_4_ = auVar147._4_4_ * fVar213;
              auVar130._8_4_ = auVar147._8_4_ * fVar213;
              auVar130._12_4_ = auVar147._12_4_ * fVar213;
              fVar212 = auVar121._0_4_;
              auVar201._0_4_ = auVar119._0_4_ * fVar212;
              auVar201._4_4_ = auVar119._4_4_ * fVar212;
              fVar214 = auVar119._8_4_;
              auVar201._8_4_ = fVar214 * fVar212;
              fVar216 = auVar119._12_4_;
              auVar201._12_4_ = fVar216 * fVar212;
              auVar121 = vsubps_avx(auVar130,auVar201);
              auVar156 = vrcpss_avx(auVar156,auVar156);
              auVar147 = vfnmadd213ss_fma(auVar156,auVar88,auVar197);
              fVar212 = auVar156._0_4_ * auVar147._0_4_;
              auVar156 = vmaxss_avx(ZEXT416((uint)local_920._0_4_),
                                    ZEXT416((uint)(fVar215 * (float)local_7e0._0_4_)));
              auVar250 = ZEXT1664(auVar156);
              auVar236._0_8_ = auVar119._0_8_ ^ 0x8000000080000000;
              auVar236._8_4_ = -fVar214;
              auVar236._12_4_ = -fVar216;
              auVar171._0_4_ = fVar211 * auVar121._0_4_ * fVar212;
              auVar171._4_4_ = fVar211 * auVar121._4_4_ * fVar212;
              auVar171._8_4_ = fVar211 * auVar121._8_4_ * fVar212;
              auVar171._12_4_ = fVar211 * auVar121._12_4_ * fVar212;
              auVar245._0_4_ = auVar119._0_4_ * fVar211;
              auVar245._4_4_ = auVar119._4_4_ * fVar211;
              auVar245._8_4_ = fVar214 * fVar211;
              auVar245._12_4_ = fVar216 * fVar211;
              if (fVar213 < -fVar213) {
                auVar285 = ZEXT1664(auVar185);
                fVar211 = sqrtf(fVar213);
                auVar250 = ZEXT464(auVar156._0_4_);
                auVar92 = ZEXT416(auVar92._0_4_);
                uVar79 = extraout_RAX_05;
              }
              else {
                auVar88 = vsqrtss_avx(auVar88,auVar88);
                fVar211 = auVar88._0_4_;
              }
              auVar88 = vdpps_avx(auVar120,auVar245,0x7f);
              auVar184 = vfmadd213ss_fma(ZEXT416((uint)local_920._0_4_),auVar92,auVar250._0_16_);
              auVar121 = vdpps_avx(auVar236,auVar245,0x7f);
              auVar147 = vdpps_avx(auVar120,auVar171,0x7f);
              auVar185 = vdpps_avx(local_950,auVar245,0x7f);
              auVar184 = vfmadd213ss_fma(ZEXT416((uint)(auVar92._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_920._0_4_ / fVar211)),auVar184)
              ;
              fVar211 = auVar121._0_4_ + auVar147._0_4_;
              auVar266 = ZEXT464((uint)fVar211);
              fVar213 = auVar88._0_4_;
              auVar98._0_4_ = fVar213 * fVar213;
              auVar98._4_4_ = auVar88._4_4_ * auVar88._4_4_;
              auVar98._8_4_ = auVar88._8_4_ * auVar88._8_4_;
              auVar98._12_4_ = auVar88._12_4_ * auVar88._12_4_;
              auVar121 = vdpps_avx(auVar120,auVar236,0x7f);
              auVar92 = vsubps_avx(auVar89,auVar98);
              auVar147 = vrsqrtss_avx(auVar92,auVar92);
              fVar214 = auVar92._0_4_;
              fVar212 = auVar147._0_4_;
              fVar212 = fVar212 * 1.5 + fVar214 * -0.5 * fVar212 * fVar212 * fVar212;
              auVar147 = vdpps_avx(auVar120,local_950,0x7f);
              auVar121 = vfnmadd231ss_fma(auVar121,auVar88,ZEXT416((uint)fVar211));
              auVar147 = vfnmadd231ss_fma(auVar147,auVar88,auVar185);
              if (fVar214 < 0.0) {
                local_980._0_16_ = auVar121;
                local_9a0._0_4_ = fVar212;
                local_940._0_16_ = auVar147;
                auVar285 = ZEXT1664(auVar285._0_16_);
                fVar214 = sqrtf(fVar214);
                auVar266 = ZEXT1664(ZEXT416((uint)fVar211));
                auVar250 = ZEXT464(auVar156._0_4_);
                uVar79 = extraout_RAX_06;
                fVar212 = (float)local_9a0._0_4_;
                auVar147 = local_940._0_16_;
                auVar121 = local_980._0_16_;
              }
              else {
                auVar156 = vsqrtss_avx(auVar92,auVar92);
                fVar214 = auVar156._0_4_;
              }
              auVar232 = ZEXT1664(auVar89);
              auVar238 = ZEXT1664(auVar119);
              auVar156 = vpermilps_avx(local_860,0xff);
              fVar214 = fVar214 - auVar156._0_4_;
              auVar92 = vshufps_avx(auVar119,auVar119,0xff);
              auVar196 = vfmsub213ss_fma(auVar121,ZEXT416((uint)fVar212),auVar92);
              auVar279 = ZEXT1664(auVar196);
              auVar172._0_8_ = auVar185._0_8_ ^ 0x8000000080000000;
              auVar172._8_4_ = auVar185._8_4_ ^ 0x80000000;
              auVar172._12_4_ = auVar185._12_4_ ^ 0x80000000;
              auVar190._0_8_ = auVar196._0_8_ ^ 0x8000000080000000;
              auVar190._8_4_ = auVar196._8_4_ ^ 0x80000000;
              auVar190._12_4_ = auVar196._12_4_ ^ 0x80000000;
              auVar156 = ZEXT416((uint)(auVar147._0_4_ * fVar212));
              auVar147 = auVar266._0_16_;
              auVar121 = vfmsub231ss_fma(ZEXT416((uint)(auVar185._0_4_ * auVar196._0_4_)),auVar147,
                                         auVar156);
              auVar156 = vinsertps_avx(auVar190,auVar156,0x1c);
              uVar84 = auVar121._0_4_;
              auVar191._4_4_ = uVar84;
              auVar191._0_4_ = uVar84;
              auVar191._8_4_ = uVar84;
              auVar191._12_4_ = uVar84;
              auVar156 = vdivps_avx(auVar156,auVar191);
              auVar121 = vinsertps_avx(auVar147,auVar172,0x10);
              auVar121 = vdivps_avx(auVar121,auVar191);
              auVar157._0_4_ = fVar213 * auVar156._0_4_ + fVar214 * auVar121._0_4_;
              auVar157._4_4_ = fVar213 * auVar156._4_4_ + fVar214 * auVar121._4_4_;
              auVar157._8_4_ = fVar213 * auVar156._8_4_ + fVar214 * auVar121._8_4_;
              auVar157._12_4_ = fVar213 * auVar156._12_4_ + fVar214 * auVar121._12_4_;
              auVar90 = vsubps_avx(auVar90,auVar157);
              auVar156 = vandps_avx(auVar88,auVar234);
              if (auVar156._0_4_ < auVar184._0_4_) {
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(auVar184._0_4_ + auVar250._0_4_)),
                                          local_800._0_16_,ZEXT416(0x36000000));
                auVar156 = vandps_avx(ZEXT416((uint)fVar214),auVar234);
                if (auVar156._0_4_ < auVar88._0_4_) {
                  bVar85 = uVar83 < 5;
                  fVar211 = auVar90._0_4_ + (float)local_900._0_4_;
                  if ((fVar87 <= fVar211) &&
                     (fVar212 = *(float *)(ray + k * 4 + 0x80), fVar211 <= fVar212)) {
                    auVar156 = vmovshdup_avx(auVar90);
                    bVar86 = 0;
                    if ((auVar156._0_4_ < 0.0) || (1.0 < auVar156._0_4_)) goto LAB_0116cdc8;
                    auVar156 = vrsqrtss_avx(auVar89,auVar89);
                    fVar213 = auVar156._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar77].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (bVar86 = 1, pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar195 = fVar213 * 1.5 + fVar195 * -0.5 * fVar213 * fVar213 * fVar213;
                        local_ae0 = auVar120._0_4_;
                        fStack_adc = auVar120._4_4_;
                        fStack_ad8 = auVar120._8_4_;
                        fStack_ad4 = auVar120._12_4_;
                        auVar158._0_4_ = fVar195 * local_ae0;
                        auVar158._4_4_ = fVar195 * fStack_adc;
                        auVar158._8_4_ = fVar195 * fStack_ad8;
                        auVar158._12_4_ = fVar195 * fStack_ad4;
                        auVar121 = vfmadd213ps_fma(auVar92,auVar158,auVar119);
                        auVar156 = vshufps_avx(auVar158,auVar158,0xc9);
                        auVar120 = vshufps_avx(auVar119,auVar119,0xc9);
                        auVar159._0_4_ = auVar158._0_4_ * auVar120._0_4_;
                        auVar159._4_4_ = auVar158._4_4_ * auVar120._4_4_;
                        auVar159._8_4_ = auVar158._8_4_ * auVar120._8_4_;
                        auVar159._12_4_ = auVar158._12_4_ * auVar120._12_4_;
                        auVar88 = vfmsub231ps_fma(auVar159,auVar119,auVar156);
                        auVar156 = vshufps_avx(auVar88,auVar88,0xc9);
                        auVar120 = vshufps_avx(auVar121,auVar121,0xc9);
                        auVar88 = vshufps_avx(auVar88,auVar88,0xd2);
                        auVar99._0_4_ = auVar121._0_4_ * auVar88._0_4_;
                        auVar99._4_4_ = auVar121._4_4_ * auVar88._4_4_;
                        auVar99._8_4_ = auVar121._8_4_ * auVar88._8_4_;
                        auVar99._12_4_ = auVar121._12_4_ * auVar88._12_4_;
                        auVar156 = vfmsub231ps_fma(auVar99,auVar156,auVar120);
                        local_770 = vshufps_avx(auVar90,auVar90,0x55);
                        local_7a0 = (RTCHitN  [16])vshufps_avx(auVar156,auVar156,0x55);
                        auStack_790 = vshufps_avx(auVar156,auVar156,0xaa);
                        local_780 = auVar156._0_4_;
                        local_760 = ZEXT416(0) << 0x20;
                        local_750 = CONCAT44(uStack_7bc,local_7c0);
                        uStack_748 = CONCAT44(uStack_7b4,uStack_7b8);
                        local_740._4_4_ = uStack_7ac;
                        local_740._0_4_ = local_7b0;
                        local_740._8_4_ = uStack_7a8;
                        local_740._12_4_ = uStack_7a4;
                        vpcmpeqd_avx2(ZEXT1632(local_740),ZEXT1632(local_740));
                        uStack_72c = context->user->instID[0];
                        local_730 = uStack_72c;
                        uStack_728 = uStack_72c;
                        uStack_724 = uStack_72c;
                        uStack_720 = context->user->instPrimID[0];
                        uStack_71c = uStack_720;
                        uStack_718 = uStack_720;
                        uStack_714 = uStack_720;
                        *(float *)(ray + k * 4 + 0x80) = fVar211;
                        local_8f0 = *(undefined1 (*) [16])
                                     (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                        local_9f0.valid = (int *)local_8f0;
                        local_9f0.geometryUserPtr = pGVar2->userPtr;
                        local_9f0.context = context->user;
                        local_9f0.hit = local_7a0;
                        local_9f0.N = 4;
                        local_9f0.ray = (RTCRayN *)ray;
                        uStack_77c = local_780;
                        uStack_778 = local_780;
                        uStack_774 = local_780;
                        if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar232 = ZEXT1664(auVar89);
                          auVar238 = ZEXT1664(auVar119);
                          auVar266 = ZEXT1664(auVar147);
                          auVar279 = ZEXT1664(auVar196);
                          auVar285 = ZEXT1664(auVar285._0_16_);
                          (*pGVar2->occlusionFilterN)(&local_9f0);
                        }
                        if (local_8f0 == (undefined1  [16])0x0) {
                          auVar90 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                          auVar90 = auVar90 ^ _DAT_01f46b70;
                        }
                        else {
                          p_Var3 = context->args->filter;
                          if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar232 = ZEXT1664(auVar232._0_16_);
                            auVar238 = ZEXT1664(auVar238._0_16_);
                            auVar266 = ZEXT1664(auVar266._0_16_);
                            auVar279 = ZEXT1664(auVar279._0_16_);
                            auVar285 = ZEXT1664(auVar285._0_16_);
                            (*p_Var3)(&local_9f0);
                          }
                          auVar89 = vpcmpeqd_avx(local_8f0,_DAT_01f45a50);
                          auVar90 = auVar89 ^ _DAT_01f46b70;
                          auVar160._8_4_ = 0xff800000;
                          auVar160._0_8_ = 0xff800000ff800000;
                          auVar160._12_4_ = 0xff800000;
                          auVar89 = vblendvps_avx(auVar160,*(undefined1 (*) [16])
                                                            (local_9f0.ray + 0x80),auVar89);
                          *(undefined1 (*) [16])(local_9f0.ray + 0x80) = auVar89;
                        }
                        auVar131._8_8_ = 0x100000001;
                        auVar131._0_8_ = 0x100000001;
                        bVar86 = (auVar131 & auVar90) != (undefined1  [16])0x0;
                        if (!(bool)bVar86) {
                          *(float *)(ray + k * 4 + 0x80) = fVar212;
                        }
                      }
                      goto LAB_0116cdc8;
                    }
                  }
                  bVar86 = 0;
                  goto LAB_0116cdc8;
                }
              }
            }
            bVar85 = false;
LAB_0116cdc8:
            uVar84 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar256._4_4_ = uVar84;
            auVar256._0_4_ = uVar84;
            auVar256._8_4_ = uVar84;
            auVar256._12_4_ = uVar84;
            auVar256._16_4_ = uVar84;
            auVar256._20_4_ = uVar84;
            auVar256._24_4_ = uVar84;
            auVar256._28_4_ = uVar84;
            auVar250 = ZEXT3264(auVar256);
            bVar82 = bVar82 | bVar85 & bVar86;
            auVar12 = vcmpps_avx(_local_9c0,auVar256,2);
          }
          auVar140._0_4_ = local_8c0._0_4_ + local_440._0_4_;
          auVar140._4_4_ = local_8c0._4_4_ + local_440._4_4_;
          auVar140._8_4_ = local_8c0._8_4_ + local_440._8_4_;
          auVar140._12_4_ = local_8c0._12_4_ + local_440._12_4_;
          auVar140._16_4_ = local_8c0._16_4_ + local_440._16_4_;
          auVar140._20_4_ = local_8c0._20_4_ + local_440._20_4_;
          auVar140._24_4_ = local_8c0._24_4_ + local_440._24_4_;
          auVar140._28_4_ = local_8c0._28_4_ + local_440._28_4_;
          uVar84 = auVar250._0_4_;
          auVar176._4_4_ = uVar84;
          auVar176._0_4_ = uVar84;
          auVar176._8_4_ = uVar84;
          auVar176._12_4_ = uVar84;
          auVar176._16_4_ = uVar84;
          auVar176._20_4_ = uVar84;
          auVar176._24_4_ = uVar84;
          auVar176._28_4_ = uVar84;
          auVar257 = ZEXT3264(_local_8c0);
          auVar12 = vcmpps_avx(auVar140,auVar176,2);
          auVar102 = vandps_avx(local_680,local_660);
          auVar102 = vandps_avx(auVar12,auVar102);
          auVar193._0_4_ = local_8c0._0_4_ + local_400._0_4_;
          auVar193._4_4_ = local_8c0._4_4_ + local_400._4_4_;
          auVar193._8_4_ = local_8c0._8_4_ + local_400._8_4_;
          auVar193._12_4_ = local_8c0._12_4_ + local_400._12_4_;
          auVar193._16_4_ = local_8c0._16_4_ + local_400._16_4_;
          auVar193._20_4_ = local_8c0._20_4_ + local_400._20_4_;
          auVar193._24_4_ = local_8c0._24_4_ + local_400._24_4_;
          auVar193._28_4_ = local_8c0._28_4_ + local_400._28_4_;
          auVar12 = vcmpps_avx(auVar193,auVar176,2);
          auVar11 = vandps_avx(auVar11,_local_820);
          auVar11 = vandps_avx(auVar12,auVar11);
          auVar11 = vorps_avx(auVar102,auVar11);
          if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar11 >> 0x7f,0) != '\0') ||
                (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar11 >> 0xbf,0) != '\0') ||
              (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar11[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar78 * 0x60) = auVar11;
            auVar102 = vblendvps_avx(_local_400,local_440,auVar102);
            *(undefined1 (*) [32])(auStack_160 + uVar78 * 0x60) = auVar102;
            uVar79 = vmovlps_avx(local_630);
            (&uStack_140)[uVar78 * 0xc] = uVar79;
            aiStack_138[uVar78 * 0x18] = local_c04 + 1;
            uVar78 = (ulong)((int)uVar78 + 1);
          }
          auVar250 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
        }
      }
    }
    while( true ) {
      uVar76 = (uint)uVar78;
      if (uVar76 == 0) {
        if (bVar82 != 0) goto LAB_0116d38a;
        uVar84 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar101._4_4_ = uVar84;
        auVar101._0_4_ = uVar84;
        auVar101._8_4_ = uVar84;
        auVar101._12_4_ = uVar84;
        auVar4 = vcmpps_avx(local_640,auVar101,2);
        uVar77 = vmovmskps_avx(auVar4);
        local_8c8 = (ulong)((uint)local_8d0 & uVar77);
        goto LAB_0116aaf0;
      }
      uVar78 = (ulong)(uVar76 - 1);
      lVar80 = uVar78 * 0x60;
      auVar102 = *(undefined1 (*) [32])(auStack_160 + lVar80);
      auVar115._0_4_ = auVar257._0_4_ + auVar102._0_4_;
      auVar115._4_4_ = auVar257._4_4_ + auVar102._4_4_;
      auVar115._8_4_ = auVar257._8_4_ + auVar102._8_4_;
      auVar115._12_4_ = auVar257._12_4_ + auVar102._12_4_;
      auVar115._16_4_ = auVar257._16_4_ + auVar102._16_4_;
      auVar115._20_4_ = auVar257._20_4_ + auVar102._20_4_;
      auVar115._24_4_ = auVar257._24_4_ + auVar102._24_4_;
      auVar115._28_4_ = auVar257._28_4_ + auVar102._28_4_;
      uVar84 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar177._4_4_ = uVar84;
      auVar177._0_4_ = uVar84;
      auVar177._8_4_ = uVar84;
      auVar177._12_4_ = uVar84;
      auVar177._16_4_ = uVar84;
      auVar177._20_4_ = uVar84;
      auVar177._24_4_ = uVar84;
      auVar177._28_4_ = uVar84;
      auVar11 = vcmpps_avx(auVar115,auVar177,2);
      _local_7a0 = vandps_avx(auVar11,*(undefined1 (*) [32])(auStack_180 + lVar80));
      auVar11 = *(undefined1 (*) [32])(auStack_180 + lVar80) & auVar11;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0x7f,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0xbf,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar11[0x1f] < '\0') break;
      uVar78 = (ulong)(uVar76 - 1);
    }
    auVar164._8_4_ = 0x7f800000;
    auVar164._0_8_ = 0x7f8000007f800000;
    auVar164._12_4_ = 0x7f800000;
    auVar164._16_4_ = 0x7f800000;
    auVar164._20_4_ = 0x7f800000;
    auVar164._24_4_ = 0x7f800000;
    auVar164._28_4_ = 0x7f800000;
    auVar102 = vblendvps_avx(auVar164,auVar102,_local_7a0);
    auVar11 = vshufps_avx(auVar102,auVar102,0xb1);
    auVar11 = vminps_avx(auVar102,auVar11);
    auVar12 = vshufpd_avx(auVar11,auVar11,5);
    auVar11 = vminps_avx(auVar11,auVar12);
    auVar12 = vpermpd_avx2(auVar11,0x4e);
    auVar11 = vminps_avx(auVar11,auVar12);
    auVar11 = vcmpps_avx(auVar102,auVar11,0);
    auVar12 = _local_7a0 & auVar11;
    auVar102 = _local_7a0;
    if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0x7f,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar12 >> 0xbf,0) != '\0') ||
        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar12[0x1f] < '\0')
    {
      auVar102 = vandps_avx(auVar11,_local_7a0);
    }
    uVar81 = vmovmskps_avx(auVar102);
    iVar20 = 0;
    for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x80000000) {
      iVar20 = iVar20 + 1;
    }
    *(undefined4 *)(local_7a0 + (uint)(iVar20 << 2)) = 0;
    uVar79 = (&uStack_140)[uVar78 * 0xc];
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar79;
    local_c04 = aiStack_138[uVar78 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar80) = _local_7a0;
    uVar81 = uVar76 - 1;
    if ((((((((_local_7a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_7a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_7a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_7a0 >> 0x7f,0) != '\0') ||
          (_local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_7a0 >> 0xbf,0) != '\0') ||
        (_local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_7a0[0x1f] < '\0') {
      uVar81 = uVar76;
    }
    uVar84 = (undefined4)uVar79;
    auVar141._4_4_ = uVar84;
    auVar141._0_4_ = uVar84;
    auVar141._8_4_ = uVar84;
    auVar141._12_4_ = uVar84;
    auVar141._16_4_ = uVar84;
    auVar141._20_4_ = uVar84;
    auVar141._24_4_ = uVar84;
    auVar141._28_4_ = uVar84;
    auVar90 = vmovshdup_avx(auVar100);
    auVar90 = vsubps_avx(auVar90,auVar100);
    auVar116._0_4_ = auVar90._0_4_;
    auVar116._4_4_ = auVar116._0_4_;
    auVar116._8_4_ = auVar116._0_4_;
    auVar116._12_4_ = auVar116._0_4_;
    auVar116._16_4_ = auVar116._0_4_;
    auVar116._20_4_ = auVar116._0_4_;
    auVar116._24_4_ = auVar116._0_4_;
    auVar116._28_4_ = auVar116._0_4_;
    auVar90 = vfmadd132ps_fma(auVar116,auVar141,_DAT_01f7b040);
    local_440 = ZEXT1632(auVar90);
    local_630._8_8_ = 0;
    local_630._0_8_ = *(ulong *)(local_440 + (uint)(iVar20 << 2));
    uVar78 = (ulong)uVar81;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }